

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx2::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  LinearSpace3fa *pLVar2;
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [32];
  Primitive PVar10;
  Geometry *pGVar11;
  code *pcVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  long lVar23;
  long lVar24;
  ulong uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  long lVar72;
  undefined1 auVar73 [32];
  undefined8 uVar74;
  undefined8 uVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [28];
  bool bVar81;
  int iVar82;
  uint uVar83;
  ulong uVar84;
  uint uVar85;
  ulong uVar86;
  byte bVar87;
  long lVar88;
  ulong uVar89;
  bool bVar90;
  undefined4 uVar91;
  undefined8 uVar92;
  float fVar109;
  vint4 bi_2;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar108;
  float fVar110;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar97 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined8 uVar114;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar127;
  undefined1 auVar126 [64];
  undefined1 extraout_var [56];
  float fVar128;
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar149;
  vint4 ai_2;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar148 [64];
  vint4 ai;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar161 [16];
  undefined1 auVar166 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  vint4 ai_1;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar204 [32];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar189;
  float fVar190;
  undefined1 auVar183 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar184 [32];
  float fVar191;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar208;
  undefined1 auVar203 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar209 [32];
  float fVar215;
  float fVar216;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar218;
  undefined1 auVar212 [32];
  float fVar217;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined1 local_920 [32];
  ulong local_8c0;
  undefined4 local_800;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  int local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_380 [32];
  float local_360 [4];
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar162 [32];
  
  PVar10 = prim[1];
  uVar84 = (ulong)(byte)PVar10;
  lVar72 = uVar84 * 0x19;
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar129 = *(float *)(prim + lVar72 + 0x12);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar93._0_4_ = fVar129 * auVar14._0_4_;
  auVar93._4_4_ = fVar129 * auVar14._4_4_;
  auVar93._8_4_ = fVar129 * auVar14._8_4_;
  auVar93._12_4_ = fVar129 * auVar14._12_4_;
  auVar157._0_4_ = fVar129 * auVar15._0_4_;
  auVar157._4_4_ = fVar129 * auVar15._4_4_;
  auVar157._8_4_ = fVar129 * auVar15._8_4_;
  auVar157._12_4_ = fVar129 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xb + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar84 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar89 = (ulong)(uint)((int)(uVar84 * 9) * 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + uVar84 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar89 = (ulong)(uint)((int)(uVar84 * 5) << 2);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar210._4_4_ = auVar157._0_4_;
  auVar210._0_4_ = auVar157._0_4_;
  auVar210._8_4_ = auVar157._0_4_;
  auVar210._12_4_ = auVar157._0_4_;
  auVar116 = vshufps_avx(auVar157,auVar157,0x55);
  auVar94 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar129 = auVar94._0_4_;
  auVar198._0_4_ = fVar129 * auVar17._0_4_;
  fVar128 = auVar94._4_4_;
  auVar198._4_4_ = fVar128 * auVar17._4_4_;
  fVar108 = auVar94._8_4_;
  auVar198._8_4_ = fVar108 * auVar17._8_4_;
  fVar109 = auVar94._12_4_;
  auVar198._12_4_ = fVar109 * auVar17._12_4_;
  auVar195._0_4_ = auVar20._0_4_ * fVar129;
  auVar195._4_4_ = auVar20._4_4_ * fVar128;
  auVar195._8_4_ = auVar20._8_4_ * fVar108;
  auVar195._12_4_ = auVar20._12_4_ * fVar109;
  auVar177._0_4_ = auVar130._0_4_ * fVar129;
  auVar177._4_4_ = auVar130._4_4_ * fVar128;
  auVar177._8_4_ = auVar130._8_4_ * fVar108;
  auVar177._12_4_ = auVar130._12_4_ * fVar109;
  auVar94 = vfmadd231ps_fma(auVar198,auVar116,auVar15);
  auVar117 = vfmadd231ps_fma(auVar195,auVar116,auVar19);
  auVar116 = vfmadd231ps_fma(auVar177,auVar95,auVar116);
  auVar143 = vfmadd231ps_fma(auVar94,auVar210,auVar14);
  auVar117 = vfmadd231ps_fma(auVar117,auVar210,auVar18);
  auVar151 = vfmadd231ps_fma(auVar116,auVar96,auVar210);
  auVar211._4_4_ = auVar93._0_4_;
  auVar211._0_4_ = auVar93._0_4_;
  auVar211._8_4_ = auVar93._0_4_;
  auVar211._12_4_ = auVar93._0_4_;
  auVar116 = vshufps_avx(auVar93,auVar93,0x55);
  auVar94 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar129 = auVar94._0_4_;
  auVar158._0_4_ = fVar129 * auVar17._0_4_;
  fVar128 = auVar94._4_4_;
  auVar158._4_4_ = fVar128 * auVar17._4_4_;
  fVar108 = auVar94._8_4_;
  auVar158._8_4_ = fVar108 * auVar17._8_4_;
  fVar109 = auVar94._12_4_;
  auVar158._12_4_ = fVar109 * auVar17._12_4_;
  auVar115._0_4_ = auVar20._0_4_ * fVar129;
  auVar115._4_4_ = auVar20._4_4_ * fVar128;
  auVar115._8_4_ = auVar20._8_4_ * fVar108;
  auVar115._12_4_ = auVar20._12_4_ * fVar109;
  auVar94._0_4_ = auVar130._0_4_ * fVar129;
  auVar94._4_4_ = auVar130._4_4_ * fVar128;
  auVar94._8_4_ = auVar130._8_4_ * fVar108;
  auVar94._12_4_ = auVar130._12_4_ * fVar109;
  auVar15 = vfmadd231ps_fma(auVar158,auVar116,auVar15);
  auVar17 = vfmadd231ps_fma(auVar115,auVar116,auVar19);
  auVar19 = vfmadd231ps_fma(auVar94,auVar116,auVar95);
  auVar20 = vfmadd231ps_fma(auVar15,auVar211,auVar14);
  auVar95 = vfmadd231ps_fma(auVar17,auVar211,auVar18);
  auVar130 = vfmadd231ps_fma(auVar19,auVar211,auVar96);
  local_450._8_4_ = 0x7fffffff;
  local_450._0_8_ = 0x7fffffff7fffffff;
  local_450._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar143,local_450);
  auVar150._8_4_ = 0x219392ef;
  auVar150._0_8_ = 0x219392ef219392ef;
  auVar150._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar150,1);
  auVar15 = vblendvps_avx(auVar143,auVar150,auVar14);
  auVar14 = vandps_avx(auVar117,local_450);
  auVar14 = vcmpps_avx(auVar14,auVar150,1);
  auVar17 = vblendvps_avx(auVar117,auVar150,auVar14);
  auVar14 = vandps_avx(auVar151,local_450);
  auVar14 = vcmpps_avx(auVar14,auVar150,1);
  auVar14 = vblendvps_avx(auVar151,auVar150,auVar14);
  auVar18 = vrcpps_avx(auVar15);
  auVar173._8_4_ = 0x3f800000;
  auVar173._0_8_ = &DAT_3f8000003f800000;
  auVar173._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar18,auVar173);
  auVar18 = vfmadd132ps_fma(auVar15,auVar18,auVar18);
  auVar15 = vrcpps_avx(auVar17);
  auVar17 = vfnmadd213ps_fma(auVar17,auVar15,auVar173);
  auVar19 = vfmadd132ps_fma(auVar17,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar17 = vfnmadd213ps_fma(auVar14,auVar15,auVar173);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar84 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar96 = vfmadd132ps_fma(auVar17,auVar15,auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar20);
  auVar151._0_4_ = auVar18._0_4_ * auVar14._0_4_;
  auVar151._4_4_ = auVar18._4_4_ * auVar14._4_4_;
  auVar151._8_4_ = auVar18._8_4_ * auVar14._8_4_;
  auVar151._12_4_ = auVar18._12_4_ * auVar14._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar84 * 9 + 6);
  auVar14 = vpmovsxwd_avx(auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar20);
  auVar159._0_4_ = auVar18._0_4_ * auVar14._0_4_;
  auVar159._4_4_ = auVar18._4_4_ * auVar14._4_4_;
  auVar159._8_4_ = auVar18._8_4_ * auVar14._8_4_;
  auVar159._12_4_ = auVar18._12_4_ * auVar14._12_4_;
  auVar117._1_3_ = 0;
  auVar117[0] = PVar10;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar15 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar84 * -2 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar95);
  auVar178._0_4_ = auVar14._0_4_ * auVar19._0_4_;
  auVar178._4_4_ = auVar14._4_4_ * auVar19._4_4_;
  auVar178._8_4_ = auVar14._8_4_ * auVar19._8_4_;
  auVar178._12_4_ = auVar14._12_4_ * auVar19._12_4_;
  auVar14 = vcvtdq2ps_avx(auVar15);
  auVar14 = vsubps_avx(auVar14,auVar95);
  auVar116._0_4_ = auVar19._0_4_ * auVar14._0_4_;
  auVar116._4_4_ = auVar19._4_4_ * auVar14._4_4_;
  auVar116._8_4_ = auVar19._8_4_ * auVar14._8_4_;
  auVar116._12_4_ = auVar19._12_4_ * auVar14._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar89 + uVar84 + 6);
  auVar14 = vpmovsxwd_avx(auVar19);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar130);
  auVar143._0_4_ = auVar96._0_4_ * auVar14._0_4_;
  auVar143._4_4_ = auVar96._4_4_ * auVar14._4_4_;
  auVar143._8_4_ = auVar96._8_4_ * auVar14._8_4_;
  auVar143._12_4_ = auVar96._12_4_ * auVar14._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar84 * 0x17 + 6);
  auVar14 = vpmovsxwd_avx(auVar20);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar14 = vsubps_avx(auVar14,auVar130);
  auVar95._0_4_ = auVar96._0_4_ * auVar14._0_4_;
  auVar95._4_4_ = auVar96._4_4_ * auVar14._4_4_;
  auVar95._8_4_ = auVar96._8_4_ * auVar14._8_4_;
  auVar95._12_4_ = auVar96._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar151,auVar159);
  auVar15 = vpminsd_avx(auVar178,auVar116);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar143,auVar95);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar183._4_4_ = uVar91;
  auVar183._0_4_ = uVar91;
  auVar183._8_4_ = uVar91;
  auVar183._12_4_ = uVar91;
  auVar15 = vmaxps_avx(auVar15,auVar183);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_460._0_4_ = auVar14._0_4_ * 0.99999964;
  local_460._4_4_ = auVar14._4_4_ * 0.99999964;
  local_460._8_4_ = auVar14._8_4_ * 0.99999964;
  local_460._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar151,auVar159);
  auVar15 = vpmaxsd_avx(auVar178,auVar116);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar143,auVar95);
  uVar91 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar130._4_4_ = uVar91;
  auVar130._0_4_ = uVar91;
  auVar130._8_4_ = uVar91;
  auVar130._12_4_ = uVar91;
  auVar15 = vminps_avx(auVar15,auVar130);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar96._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar96._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar96._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar96._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar117[4] = PVar10;
  auVar117._5_3_ = 0;
  auVar117[8] = PVar10;
  auVar117._9_3_ = 0;
  auVar117[0xc] = PVar10;
  auVar117._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar117,_DAT_01ff0cf0);
  auVar14 = vcmpps_avx(local_460,auVar96,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar85 = vmovmskps_avx(auVar14);
  bVar90 = uVar85 != 0;
  if (bVar90) {
    uVar85 = uVar85 & 0xff;
    local_600 = mm_lookupmask_ps._16_8_;
    uStack_5f8 = mm_lookupmask_ps._24_8_;
    uStack_5f0 = mm_lookupmask_ps._16_8_;
    uStack_5e8 = mm_lookupmask_ps._24_8_;
    pLVar2 = pre->ray_space + k;
    iVar82 = 1 << ((uint)k & 0x1f);
    auVar98._4_4_ = iVar82;
    auVar98._0_4_ = iVar82;
    auVar98._8_4_ = iVar82;
    auVar98._12_4_ = iVar82;
    auVar98._16_4_ = iVar82;
    auVar98._20_4_ = iVar82;
    auVar98._24_4_ = iVar82;
    auVar98._28_4_ = iVar82;
    auVar106 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar98 = vpand_avx2(auVar98,auVar106);
    local_2c0 = vpcmpeqd_avx2(auVar98,auVar106);
    do {
      auVar98 = local_5a0;
      lVar23 = 0;
      uVar89 = (ulong)uVar85;
      for (uVar84 = uVar89; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar89 = uVar89 - 1 & uVar89;
      local_680._4_4_ = *(undefined4 *)(prim + lVar23 * 4 + 6);
      local_5c0._0_4_ = local_680._4_4_;
      uVar84 = (ulong)(uint)((int)lVar23 << 6);
      uVar85 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar85].ptr;
      pPVar1 = prim + uVar84 + lVar72 + 0x16;
      uVar74 = *(undefined8 *)pPVar1;
      uVar75 = *(undefined8 *)(pPVar1 + 8);
      auVar15 = *(undefined1 (*) [16])pPVar1;
      auVar14 = *(undefined1 (*) [16])pPVar1;
      if (uVar89 != 0) {
        uVar86 = uVar89 - 1 & uVar89;
        for (uVar25 = uVar89; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        }
        if (uVar86 != 0) {
          for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_610 = *(undefined1 (*) [16])(prim + uVar84 + lVar72 + 0x26);
      local_620 = *(undefined1 (*) [16])(prim + uVar84 + lVar72 + 0x36);
      local_630 = *(undefined1 (*) [16])(prim + uVar84 + lVar72 + 0x46);
      iVar82 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar20 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar18 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar20);
      uVar91 = auVar18._0_4_;
      auVar152._4_4_ = uVar91;
      auVar152._0_4_ = uVar91;
      auVar152._8_4_ = uVar91;
      auVar152._12_4_ = uVar91;
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      aVar7 = (pLVar2->vx).field_0;
      aVar8 = (pLVar2->vy).field_0;
      fVar129 = (pLVar2->vz).field_0.m128[0];
      fVar128 = (pLVar2->vz).field_0.m128[1];
      fVar108 = (pLVar2->vz).field_0.m128[2];
      fVar109 = (pLVar2->vz).field_0.m128[3];
      auVar167._0_4_ = fVar129 * auVar18._0_4_;
      auVar167._4_4_ = fVar128 * auVar18._4_4_;
      auVar167._8_4_ = fVar108 * auVar18._8_4_;
      auVar167._12_4_ = fVar109 * auVar18._12_4_;
      auVar17 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar8,auVar17);
      auVar95 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar7,auVar152);
      auVar17 = vblendps_avx(auVar95,*(undefined1 (*) [16])pPVar1,8);
      auVar19 = vsubps_avx(local_610,auVar20);
      uVar91 = auVar19._0_4_;
      auVar168._4_4_ = uVar91;
      auVar168._0_4_ = uVar91;
      auVar168._8_4_ = uVar91;
      auVar168._12_4_ = uVar91;
      auVar18 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar196._0_4_ = fVar129 * auVar19._0_4_;
      auVar196._4_4_ = fVar128 * auVar19._4_4_;
      auVar196._8_4_ = fVar108 * auVar19._8_4_;
      auVar196._12_4_ = fVar109 * auVar19._12_4_;
      auVar18 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar8,auVar18);
      auVar130 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar7,auVar168);
      auVar18 = vblendps_avx(auVar130,local_610,8);
      auVar96 = vsubps_avx(local_620,auVar20);
      uVar91 = auVar96._0_4_;
      auVar174._4_4_ = uVar91;
      auVar174._0_4_ = uVar91;
      auVar174._8_4_ = uVar91;
      auVar174._12_4_ = uVar91;
      auVar19 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar199._0_4_ = fVar129 * auVar96._0_4_;
      auVar199._4_4_ = fVar128 * auVar96._4_4_;
      auVar199._8_4_ = fVar108 * auVar96._8_4_;
      auVar199._12_4_ = fVar109 * auVar96._12_4_;
      auVar19 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar8,auVar19);
      auVar116 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar7,auVar174);
      auVar19 = vblendps_avx(auVar116,local_620,8);
      auVar96 = vsubps_avx(local_630,auVar20);
      uVar91 = auVar96._0_4_;
      auVar175._4_4_ = uVar91;
      auVar175._0_4_ = uVar91;
      auVar175._8_4_ = uVar91;
      auVar175._12_4_ = uVar91;
      auVar20 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar203._0_4_ = fVar129 * auVar96._0_4_;
      auVar203._4_4_ = fVar128 * auVar96._4_4_;
      auVar203._8_4_ = fVar108 * auVar96._8_4_;
      auVar203._12_4_ = fVar109 * auVar96._12_4_;
      auVar20 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar8,auVar20);
      auVar94 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar7,auVar175);
      auVar20 = vblendps_avx(auVar94,local_630,8);
      auVar17 = vandps_avx(auVar17,local_450);
      auVar18 = vandps_avx(auVar18,local_450);
      auVar96 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vandps_avx(auVar19,local_450);
      auVar18 = vandps_avx(auVar20,local_450);
      auVar17 = vmaxps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar96,auVar17);
      auVar18 = vmovshdup_avx(auVar17);
      auVar18 = vmaxss_avx(auVar18,auVar17);
      auVar17 = vshufpd_avx(auVar17,auVar17,1);
      auVar17 = vmaxss_avx(auVar17,auVar18);
      lVar23 = (long)iVar82 * 0x44;
      auVar18 = vmovshdup_avx(auVar95);
      uVar92 = auVar18._0_8_;
      local_580._8_8_ = uVar92;
      local_580._0_8_ = uVar92;
      local_580._16_8_ = uVar92;
      local_580._24_8_ = uVar92;
      auVar18 = vmovshdup_avx(auVar130);
      uVar92 = auVar18._0_8_;
      local_500._8_8_ = uVar92;
      local_500._0_8_ = uVar92;
      local_500._16_8_ = uVar92;
      local_500._24_8_ = uVar92;
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x908);
      uVar91 = auVar116._0_4_;
      local_6a0._4_4_ = uVar91;
      local_6a0._0_4_ = uVar91;
      local_6a0._8_4_ = uVar91;
      local_6a0._12_4_ = uVar91;
      local_6a0._16_4_ = uVar91;
      local_6a0._20_4_ = uVar91;
      local_6a0._24_4_ = uVar91;
      local_6a0._28_4_ = uVar91;
      auVar18 = vmovshdup_avx(auVar116);
      uVar92 = auVar18._0_8_;
      auVar200._8_8_ = uVar92;
      auVar200._0_8_ = uVar92;
      auVar200._16_8_ = uVar92;
      auVar200._24_8_ = uVar92;
      fVar129 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar23 + 0xd8c);
      auVar80 = *(undefined1 (*) [28])(bezier_basis0 + lVar23 + 0xd8c);
      local_6e0 = auVar94._0_4_;
      auVar18 = vmovshdup_avx(auVar94);
      uVar92 = auVar18._0_8_;
      auVar105._4_4_ = local_6e0 * *(float *)(bezier_basis0 + lVar23 + 0xd90);
      auVar105._0_4_ = local_6e0 * fVar129;
      auVar105._8_4_ = local_6e0 * *(float *)(bezier_basis0 + lVar23 + 0xd94);
      auVar105._12_4_ = local_6e0 * *(float *)(bezier_basis0 + lVar23 + 0xd98);
      auVar105._16_4_ = local_6e0 * *(float *)(bezier_basis0 + lVar23 + 0xd9c);
      auVar105._20_4_ = local_6e0 * *(float *)(bezier_basis0 + lVar23 + 0xda0);
      auVar105._24_4_ = local_6e0 * *(float *)(bezier_basis0 + lVar23 + 0xda4);
      auVar105._28_4_ = *(undefined4 *)(bezier_basis0 + lVar23 + 0xda8);
      auVar19 = vfmadd231ps_fma(auVar105,auVar106,local_6a0);
      fVar142 = auVar18._0_4_;
      auVar123._0_4_ = fVar142 * fVar129;
      fVar149 = auVar18._4_4_;
      auVar123._4_4_ = fVar149 * *(float *)(bezier_basis0 + lVar23 + 0xd90);
      auVar123._8_4_ = fVar142 * *(float *)(bezier_basis0 + lVar23 + 0xd94);
      auVar123._12_4_ = fVar149 * *(float *)(bezier_basis0 + lVar23 + 0xd98);
      auVar123._16_4_ = fVar142 * *(float *)(bezier_basis0 + lVar23 + 0xd9c);
      auVar123._20_4_ = fVar149 * *(float *)(bezier_basis0 + lVar23 + 0xda0);
      auVar123._24_4_ = fVar142 * *(float *)(bezier_basis0 + lVar23 + 0xda4);
      auVar123._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar123,auVar106,auVar200);
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x484);
      uVar91 = auVar130._0_4_;
      auVar212._4_4_ = uVar91;
      auVar212._0_4_ = uVar91;
      auVar212._8_4_ = uVar91;
      auVar212._12_4_ = uVar91;
      auVar212._16_4_ = uVar91;
      auVar212._20_4_ = uVar91;
      auVar212._24_4_ = uVar91;
      auVar212._28_4_ = uVar91;
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar105,auVar212);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar105,local_500);
      auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar23);
      local_800 = auVar95._0_4_;
      auVar184._4_4_ = local_800;
      auVar184._0_4_ = local_800;
      auVar184._8_4_ = local_800;
      auVar184._12_4_ = local_800;
      auVar184._16_4_ = local_800;
      auVar184._20_4_ = local_800;
      auVar184._24_4_ = local_800;
      auVar184._28_4_ = local_800;
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar123,auVar184);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar123,local_580);
      auVar204 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x908);
      fVar128 = *(float *)(bezier_basis1 + lVar23 + 0xd8c);
      fVar108 = *(float *)(bezier_basis1 + lVar23 + 0xd90);
      fVar109 = *(float *)(bezier_basis1 + lVar23 + 0xd94);
      fVar110 = *(float *)(bezier_basis1 + lVar23 + 0xd98);
      fVar111 = *(float *)(bezier_basis1 + lVar23 + 0xd9c);
      fVar112 = *(float *)(bezier_basis1 + lVar23 + 0xda0);
      fVar113 = *(float *)(bezier_basis1 + lVar23 + 0xda4);
      auVar9._4_4_ = local_6e0 * fVar108;
      auVar9._0_4_ = local_6e0 * fVar128;
      auVar9._8_4_ = local_6e0 * fVar109;
      auVar9._12_4_ = local_6e0 * fVar110;
      auVar9._16_4_ = local_6e0 * fVar111;
      auVar9._20_4_ = local_6e0 * fVar112;
      auVar9._24_4_ = local_6e0 * fVar113;
      auVar9._28_4_ = *(undefined4 *)(bezier_basis0 + lVar23 + 0xda8);
      auVar20 = vfmadd231ps_fma(auVar9,auVar204,local_6a0);
      auVar180._4_4_ = fVar149 * fVar108;
      auVar180._0_4_ = fVar142 * fVar128;
      auVar180._8_4_ = fVar142 * fVar109;
      auVar180._12_4_ = fVar149 * fVar110;
      auVar180._16_4_ = fVar142 * fVar111;
      auVar180._20_4_ = fVar149 * fVar112;
      auVar180._24_4_ = fVar142 * fVar113;
      auVar180._28_4_ = local_6e0;
      auVar96 = vfmadd231ps_fma(auVar180,auVar204,auVar200);
      auVar9 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x484);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar9,auVar212);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar9,local_500);
      auVar180 = *(undefined1 (*) [32])(bezier_basis1 + lVar23);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar180,auVar184);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar180,local_580);
      auVar99 = ZEXT1632(auVar20);
      auVar118 = ZEXT1632(auVar19);
      auVar107 = vsubps_avx(auVar99,auVar118);
      auVar135 = ZEXT1632(auVar96);
      auVar209 = ZEXT1632(auVar18);
      _local_480 = vsubps_avx(auVar135,auVar209);
      auVar100._0_4_ = auVar18._0_4_ * auVar107._0_4_;
      auVar100._4_4_ = auVar18._4_4_ * auVar107._4_4_;
      auVar100._8_4_ = auVar18._8_4_ * auVar107._8_4_;
      auVar100._12_4_ = auVar18._12_4_ * auVar107._12_4_;
      auVar100._16_4_ = auVar107._16_4_ * 0.0;
      auVar100._20_4_ = auVar107._20_4_ * 0.0;
      auVar100._24_4_ = auVar107._24_4_ * 0.0;
      auVar100._28_4_ = 0;
      fVar208 = local_480._0_4_;
      auVar119._0_4_ = fVar208 * auVar19._0_4_;
      fVar215 = local_480._4_4_;
      auVar119._4_4_ = fVar215 * auVar19._4_4_;
      fVar216 = local_480._8_4_;
      auVar119._8_4_ = fVar216 * auVar19._8_4_;
      fVar217 = local_480._12_4_;
      auVar119._12_4_ = fVar217 * auVar19._12_4_;
      fVar218 = local_480._16_4_;
      auVar119._16_4_ = fVar218 * 0.0;
      fVar182 = local_480._20_4_;
      auVar119._20_4_ = fVar182 * 0.0;
      fVar189 = local_480._24_4_;
      auVar119._24_4_ = fVar189 * 0.0;
      auVar119._28_4_ = 0;
      auVar100 = vsubps_avx(auVar100,auVar119);
      auVar18 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar114 = auVar18._0_8_;
      local_80._8_8_ = uVar114;
      local_80._0_8_ = uVar114;
      local_80._16_8_ = uVar114;
      local_80._24_8_ = uVar114;
      auVar19 = vpermilps_avx(local_610,0xff);
      uVar114 = auVar19._0_8_;
      local_a0._8_8_ = uVar114;
      local_a0._0_8_ = uVar114;
      local_a0._16_8_ = uVar114;
      local_a0._24_8_ = uVar114;
      auVar19 = vpermilps_avx(local_620,0xff);
      uVar114 = auVar19._0_8_;
      local_c0._8_8_ = uVar114;
      local_c0._0_8_ = uVar114;
      local_c0._16_8_ = uVar114;
      local_c0._24_8_ = uVar114;
      auVar19 = vpermilps_avx(local_630,0xff);
      local_e0 = auVar19._0_8_;
      local_700._0_4_ = auVar80._0_4_;
      local_700._4_4_ = auVar80._4_4_;
      fStack_6f8 = auVar80._8_4_;
      fStack_6f4 = auVar80._12_4_;
      fStack_6f0 = auVar80._16_4_;
      fStack_6ec = auVar80._20_4_;
      fStack_6e8 = auVar80._24_4_;
      fVar129 = auVar19._0_4_;
      fVar127 = auVar19._4_4_;
      auVar16._4_4_ = fVar127 * (float)local_700._4_4_;
      auVar16._0_4_ = fVar129 * (float)local_700._0_4_;
      auVar16._8_4_ = fVar129 * fStack_6f8;
      auVar16._12_4_ = fVar127 * fStack_6f4;
      auVar16._16_4_ = fVar129 * fStack_6f0;
      auVar16._20_4_ = fVar127 * fStack_6ec;
      auVar16._24_4_ = fVar129 * fStack_6e8;
      auVar16._28_4_ = auVar204._28_4_;
      auVar19 = vfmadd231ps_fma(auVar16,local_c0,auVar106);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar105,local_a0);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar123,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar22._4_4_ = fVar127 * fVar108;
      auVar22._0_4_ = fVar129 * fVar128;
      auVar22._8_4_ = fVar129 * fVar109;
      auVar22._12_4_ = fVar127 * fVar110;
      auVar22._16_4_ = fVar129 * fVar111;
      auVar22._20_4_ = fVar127 * fVar112;
      auVar22._24_4_ = fVar129 * fVar113;
      auVar22._28_4_ = auVar123._28_4_;
      auVar19 = vfmadd231ps_fma(auVar22,auVar204,local_c0);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar9,local_a0);
      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar180,local_80);
      auVar139._4_4_ = fVar215 * fVar215;
      auVar139._0_4_ = fVar208 * fVar208;
      auVar139._8_4_ = fVar216 * fVar216;
      auVar139._12_4_ = fVar217 * fVar217;
      auVar139._16_4_ = fVar218 * fVar218;
      auVar139._20_4_ = fVar182 * fVar182;
      auVar139._24_4_ = fVar189 * fVar189;
      auVar139._28_4_ = auVar18._4_4_;
      auVar18 = vfmadd231ps_fma(auVar139,auVar107,auVar107);
      auVar16 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar96));
      auVar169._4_4_ = auVar16._4_4_ * auVar16._4_4_ * auVar18._4_4_;
      auVar169._0_4_ = auVar16._0_4_ * auVar16._0_4_ * auVar18._0_4_;
      auVar169._8_4_ = auVar16._8_4_ * auVar16._8_4_ * auVar18._8_4_;
      auVar169._12_4_ = auVar16._12_4_ * auVar16._12_4_ * auVar18._12_4_;
      auVar169._16_4_ = auVar16._16_4_ * auVar16._16_4_ * 0.0;
      auVar169._20_4_ = auVar16._20_4_ * auVar16._20_4_ * 0.0;
      auVar169._24_4_ = auVar16._24_4_ * auVar16._24_4_ * 0.0;
      auVar169._28_4_ = auVar16._28_4_;
      auVar21._4_4_ = auVar100._4_4_ * auVar100._4_4_;
      auVar21._0_4_ = auVar100._0_4_ * auVar100._0_4_;
      auVar21._8_4_ = auVar100._8_4_ * auVar100._8_4_;
      auVar21._12_4_ = auVar100._12_4_ * auVar100._12_4_;
      auVar21._16_4_ = auVar100._16_4_ * auVar100._16_4_;
      auVar21._20_4_ = auVar100._20_4_ * auVar100._20_4_;
      auVar21._24_4_ = auVar100._24_4_ * auVar100._24_4_;
      auVar21._28_4_ = auVar100._28_4_;
      auVar16 = vcmpps_avx(auVar21,auVar169,2);
      fVar129 = auVar17._0_4_ * 4.7683716e-07;
      auVar101._0_4_ = (float)iVar82;
      local_5a0._4_12_ = auVar94._4_12_;
      local_5a0._0_4_ = auVar101._0_4_;
      local_5a0._16_16_ = auVar98._16_16_;
      auVar101._4_4_ = auVar101._0_4_;
      auVar101._8_4_ = auVar101._0_4_;
      auVar101._12_4_ = auVar101._0_4_;
      auVar101._16_4_ = auVar101._0_4_;
      auVar101._20_4_ = auVar101._0_4_;
      auVar101._24_4_ = auVar101._0_4_;
      auVar101._28_4_ = auVar101._0_4_;
      auVar98 = vcmpps_avx(_DAT_02020f40,auVar101,1);
      auVar18 = vpermilps_avx(auVar95,0xaa);
      uVar114 = auVar18._0_8_;
      auVar144._8_8_ = uVar114;
      auVar144._0_8_ = uVar114;
      auVar144._16_8_ = uVar114;
      auVar144._24_8_ = uVar114;
      auVar17 = vpermilps_avx(auVar130,0xaa);
      uVar114 = auVar17._0_8_;
      local_4e0._8_8_ = uVar114;
      local_4e0._0_8_ = uVar114;
      local_4e0._16_8_ = uVar114;
      local_4e0._24_8_ = uVar114;
      auVar19 = vpermilps_avx(auVar116,0xaa);
      uVar114 = auVar19._0_8_;
      auVar162._8_8_ = uVar114;
      auVar162._0_8_ = uVar114;
      auVar162._16_8_ = uVar114;
      auVar162._24_8_ = uVar114;
      auVar166 = ZEXT3264(auVar162);
      auVar17 = vshufps_avx(auVar94,auVar94,0xaa);
      uVar114 = auVar17._0_8_;
      register0x00001508 = uVar114;
      local_720 = uVar114;
      register0x00001510 = uVar114;
      register0x00001518 = uVar114;
      auVar206 = ZEXT3264(_local_720);
      auVar100 = auVar98 & auVar16;
      uVar91 = *(undefined4 *)(ray + k * 4 + 0x60);
      fStack_6dc = local_6e0;
      fStack_6d8 = local_6e0;
      fStack_6d4 = local_6e0;
      fStack_6d0 = local_6e0;
      fStack_6cc = local_6e0;
      fStack_6c8 = local_6e0;
      fStack_6c4 = local_6e0;
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0x7f,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar100 >> 0xbf,0) == '\0') &&
          (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar100[0x1f]) {
        bVar81 = false;
        auVar188 = ZEXT3264(CONCAT428(local_6e0,
                                      CONCAT424(local_6e0,
                                                CONCAT420(local_6e0,
                                                          CONCAT416(local_6e0,
                                                                    CONCAT412(local_6e0,
                                                                              CONCAT48(local_6e0,
                                                                                       CONCAT44(
                                                  local_6e0,local_6e0))))))));
        auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,CONCAT416(fVar142,
                                                  CONCAT412(fVar149,CONCAT48(fVar142,uVar92)))))));
      }
      else {
        local_5e0 = SUB84(pGVar11,0);
        uStack_5dc = (undefined4)((ulong)pGVar11 >> 0x20);
        auVar16 = vandps_avx(auVar16,auVar98);
        fVar127 = auVar17._0_4_;
        fVar208 = auVar17._4_4_;
        auVar155._4_4_ = fVar208 * fVar108;
        auVar155._0_4_ = fVar127 * fVar128;
        auVar155._8_4_ = fVar127 * fVar109;
        auVar155._12_4_ = fVar208 * fVar110;
        auVar155._16_4_ = fVar127 * fVar111;
        auVar155._20_4_ = fVar208 * fVar112;
        auVar155._24_4_ = fVar127 * fVar113;
        auVar155._28_4_ = auVar16._28_4_;
        auVar17 = vfmadd213ps_fma(auVar204,auVar162,auVar155);
        auVar17 = vfmadd213ps_fma(auVar9,local_4e0,ZEXT1632(auVar17));
        auVar17 = vfmadd213ps_fma(auVar180,auVar144,ZEXT1632(auVar17));
        auVar204._4_4_ = fVar208 * (float)local_700._4_4_;
        auVar204._0_4_ = fVar127 * (float)local_700._0_4_;
        auVar204._8_4_ = fVar127 * fStack_6f8;
        auVar204._12_4_ = fVar208 * fStack_6f4;
        auVar204._16_4_ = fVar127 * fStack_6f0;
        auVar204._20_4_ = fVar208 * fStack_6ec;
        auVar204._24_4_ = fVar127 * fStack_6e8;
        auVar204._28_4_ = auVar16._28_4_;
        auVar95 = vfmadd213ps_fma(auVar106,auVar162,auVar204);
        auVar95 = vfmadd213ps_fma(auVar105,local_4e0,ZEXT1632(auVar95));
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1210);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1694);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar23 + 0x1b18);
        fVar128 = *(float *)(bezier_basis0 + lVar23 + 0x1f9c);
        fVar108 = *(float *)(bezier_basis0 + lVar23 + 0x1fa0);
        fVar109 = *(float *)(bezier_basis0 + lVar23 + 0x1fa4);
        fVar110 = *(float *)(bezier_basis0 + lVar23 + 0x1fa8);
        fVar111 = *(float *)(bezier_basis0 + lVar23 + 0x1fac);
        fVar112 = *(float *)(bezier_basis0 + lVar23 + 0x1fb0);
        fVar113 = *(float *)(bezier_basis0 + lVar23 + 0x1fb4);
        auVar176._4_4_ = local_6e0 * fVar108;
        auVar176._0_4_ = local_6e0 * fVar128;
        auVar176._8_4_ = local_6e0 * fVar109;
        auVar176._12_4_ = local_6e0 * fVar110;
        auVar176._16_4_ = local_6e0 * fVar111;
        auVar176._20_4_ = local_6e0 * fVar112;
        auVar176._24_4_ = local_6e0 * fVar113;
        auVar176._28_4_ = auVar19._4_4_;
        auVar179._0_4_ = fVar128 * fVar142;
        auVar179._4_4_ = fVar108 * fVar149;
        auVar179._8_4_ = fVar109 * fVar142;
        auVar179._12_4_ = fVar110 * fVar149;
        auVar179._16_4_ = fVar111 * fVar142;
        auVar179._20_4_ = fVar112 * fVar149;
        auVar179._24_4_ = fVar113 * fVar142;
        auVar179._28_4_ = 0;
        auVar197._0_4_ = fVar127 * fVar128;
        auVar197._4_4_ = fVar208 * fVar108;
        auVar197._8_4_ = fVar127 * fVar109;
        auVar197._12_4_ = fVar208 * fVar110;
        auVar197._16_4_ = fVar127 * fVar111;
        auVar197._20_4_ = fVar208 * fVar112;
        auVar197._24_4_ = fVar127 * fVar113;
        auVar197._28_4_ = 0;
        auVar19 = vfmadd231ps_fma(auVar176,auVar105,local_6a0);
        auVar130 = vfmadd231ps_fma(auVar179,auVar105,auVar200);
        auVar116 = vfmadd231ps_fma(auVar197,auVar162,auVar105);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar106,auVar212);
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar106,local_500);
        auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_4e0,auVar106);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar98,auVar184);
        auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar98,local_580);
        auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar98,auVar144);
        fVar128 = *(float *)(bezier_basis1 + lVar23 + 0x1f9c);
        fVar108 = *(float *)(bezier_basis1 + lVar23 + 0x1fa0);
        fVar109 = *(float *)(bezier_basis1 + lVar23 + 0x1fa4);
        fVar110 = *(float *)(bezier_basis1 + lVar23 + 0x1fa8);
        fVar111 = *(float *)(bezier_basis1 + lVar23 + 0x1fac);
        fVar112 = *(float *)(bezier_basis1 + lVar23 + 0x1fb0);
        fVar113 = *(float *)(bezier_basis1 + lVar23 + 0x1fb4);
        auVar201._0_4_ = local_6e0 * fVar128;
        auVar201._4_4_ = local_6e0 * fVar108;
        auVar201._8_4_ = local_6e0 * fVar109;
        auVar201._12_4_ = local_6e0 * fVar110;
        auVar201._16_4_ = local_6e0 * fVar111;
        auVar201._20_4_ = local_6e0 * fVar112;
        auVar201._24_4_ = local_6e0 * fVar113;
        auVar201._28_4_ = 0;
        auVar106._4_4_ = fVar149 * fVar108;
        auVar106._0_4_ = fVar142 * fVar128;
        auVar106._8_4_ = fVar142 * fVar109;
        auVar106._12_4_ = fVar149 * fVar110;
        auVar106._16_4_ = fVar142 * fVar111;
        auVar106._20_4_ = fVar149 * fVar112;
        auVar106._24_4_ = fVar142 * fVar113;
        auVar106._28_4_ = local_6e0;
        auVar26._4_4_ = fVar208 * fVar108;
        auVar26._0_4_ = fVar127 * fVar128;
        auVar26._8_4_ = fVar127 * fVar109;
        auVar26._12_4_ = fVar208 * fVar110;
        auVar26._16_4_ = fVar127 * fVar111;
        auVar26._20_4_ = fVar208 * fVar112;
        auVar26._24_4_ = fVar127 * fVar113;
        auVar26._28_4_ = fVar208;
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1b18);
        auVar94 = vfmadd231ps_fma(auVar201,auVar98,local_6a0);
        auVar117 = vfmadd231ps_fma(auVar106,auVar98,auVar200);
        auVar143 = vfmadd231ps_fma(auVar26,auVar162,auVar98);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1694);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar98,auVar212);
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar98,local_500);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),local_4e0,auVar98);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar23 + 0x1210);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar98,auVar184);
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar98,local_580);
        auVar120._8_4_ = 0x7fffffff;
        auVar120._0_8_ = 0x7fffffff7fffffff;
        auVar120._12_4_ = 0x7fffffff;
        auVar120._16_4_ = 0x7fffffff;
        auVar120._20_4_ = 0x7fffffff;
        auVar120._24_4_ = 0x7fffffff;
        auVar120._28_4_ = 0x7fffffff;
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar144,auVar98);
        auVar98 = vandps_avx(ZEXT1632(auVar19),auVar120);
        auVar106 = vandps_avx(ZEXT1632(auVar130),auVar120);
        auVar106 = vmaxps_avx(auVar98,auVar106);
        auVar98 = vandps_avx(ZEXT1632(auVar116),auVar120);
        auVar98 = vmaxps_avx(auVar106,auVar98);
        auVar136._4_4_ = fVar129;
        auVar136._0_4_ = fVar129;
        auVar136._8_4_ = fVar129;
        auVar136._12_4_ = fVar129;
        auVar136._16_4_ = fVar129;
        auVar136._20_4_ = fVar129;
        auVar136._24_4_ = fVar129;
        auVar136._28_4_ = fVar129;
        auVar98 = vcmpps_avx(auVar98,auVar136,1);
        auVar105 = vblendvps_avx(ZEXT1632(auVar19),auVar107,auVar98);
        auVar204 = vblendvps_avx(ZEXT1632(auVar130),_local_480,auVar98);
        auVar98 = vandps_avx(ZEXT1632(auVar94),auVar120);
        auVar106 = vandps_avx(ZEXT1632(auVar117),auVar120);
        auVar9 = vmaxps_avx(auVar98,auVar106);
        auVar98 = vandps_avx(ZEXT1632(auVar143),auVar120);
        auVar98 = vmaxps_avx(auVar9,auVar98);
        auVar180 = vcmpps_avx(auVar98,auVar136,1);
        auVar98 = vblendvps_avx(ZEXT1632(auVar94),auVar107,auVar180);
        auVar9 = vblendvps_avx(ZEXT1632(auVar117),_local_480,auVar180);
        auVar19 = vfmadd213ps_fma(auVar123,auVar144,ZEXT1632(auVar95));
        auVar95 = vfmadd213ps_fma(auVar105,auVar105,ZEXT832(0) << 0x20);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar204,auVar204);
        auVar123 = vrsqrtps_avx(ZEXT1632(auVar95));
        fVar128 = auVar123._0_4_;
        fVar108 = auVar123._4_4_;
        fVar109 = auVar123._8_4_;
        fVar110 = auVar123._12_4_;
        fVar111 = auVar123._16_4_;
        fVar112 = auVar123._20_4_;
        fVar113 = auVar123._24_4_;
        auVar27._4_4_ = fVar108 * fVar108 * fVar108 * auVar95._4_4_ * -0.5;
        auVar27._0_4_ = fVar128 * fVar128 * fVar128 * auVar95._0_4_ * -0.5;
        auVar27._8_4_ = fVar109 * fVar109 * fVar109 * auVar95._8_4_ * -0.5;
        auVar27._12_4_ = fVar110 * fVar110 * fVar110 * auVar95._12_4_ * -0.5;
        auVar27._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar27._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar27._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
        auVar27._28_4_ = 0;
        auVar213._8_4_ = 0x3fc00000;
        auVar213._0_8_ = 0x3fc000003fc00000;
        auVar213._12_4_ = 0x3fc00000;
        auVar213._16_4_ = 0x3fc00000;
        auVar213._20_4_ = 0x3fc00000;
        auVar213._24_4_ = 0x3fc00000;
        auVar213._28_4_ = 0x3fc00000;
        auVar95 = vfmadd231ps_fma(auVar27,auVar213,auVar123);
        fVar128 = auVar95._0_4_;
        fVar108 = auVar95._4_4_;
        auVar28._4_4_ = auVar204._4_4_ * fVar108;
        auVar28._0_4_ = auVar204._0_4_ * fVar128;
        fVar109 = auVar95._8_4_;
        auVar28._8_4_ = auVar204._8_4_ * fVar109;
        fVar110 = auVar95._12_4_;
        auVar28._12_4_ = auVar204._12_4_ * fVar110;
        auVar28._16_4_ = auVar204._16_4_ * 0.0;
        auVar28._20_4_ = auVar204._20_4_ * 0.0;
        auVar28._24_4_ = auVar204._24_4_ * 0.0;
        auVar28._28_4_ = auVar123._28_4_;
        auVar29._4_4_ = -auVar105._4_4_ * fVar108;
        auVar29._0_4_ = -auVar105._0_4_ * fVar128;
        auVar29._8_4_ = -auVar105._8_4_ * fVar109;
        auVar29._12_4_ = -auVar105._12_4_ * fVar110;
        auVar29._16_4_ = -auVar105._16_4_ * 0.0;
        auVar29._20_4_ = -auVar105._20_4_ * 0.0;
        auVar29._24_4_ = -auVar105._24_4_ * 0.0;
        auVar29._28_4_ = auVar106._28_4_;
        auVar95 = vfmadd213ps_fma(auVar98,auVar98,ZEXT832(0) << 0x20);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar9,auVar9);
        auVar106 = vrsqrtps_avx(ZEXT1632(auVar95));
        auVar30._28_4_ = auVar180._28_4_;
        auVar30._0_28_ =
             ZEXT1628(CONCAT412(fVar110 * 0.0,
                                CONCAT48(fVar109 * 0.0,CONCAT44(fVar108 * 0.0,fVar128 * 0.0))));
        fVar128 = auVar106._0_4_;
        fVar108 = auVar106._4_4_;
        fVar109 = auVar106._8_4_;
        fVar110 = auVar106._12_4_;
        fVar111 = auVar106._16_4_;
        fVar112 = auVar106._20_4_;
        fVar113 = auVar106._24_4_;
        auVar31._4_4_ = fVar108 * fVar108 * fVar108 * auVar95._4_4_ * -0.5;
        auVar31._0_4_ = fVar128 * fVar128 * fVar128 * auVar95._0_4_ * -0.5;
        auVar31._8_4_ = fVar109 * fVar109 * fVar109 * auVar95._8_4_ * -0.5;
        auVar31._12_4_ = fVar110 * fVar110 * fVar110 * auVar95._12_4_ * -0.5;
        auVar31._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar31._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar31._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
        auVar31._28_4_ = 0;
        auVar95 = vfmadd231ps_fma(auVar31,auVar213,auVar106);
        fVar128 = auVar95._0_4_;
        fVar108 = auVar95._4_4_;
        auVar32._4_4_ = auVar9._4_4_ * fVar108;
        auVar32._0_4_ = auVar9._0_4_ * fVar128;
        fVar109 = auVar95._8_4_;
        auVar32._8_4_ = auVar9._8_4_ * fVar109;
        fVar110 = auVar95._12_4_;
        auVar32._12_4_ = auVar9._12_4_ * fVar110;
        auVar32._16_4_ = auVar9._16_4_ * 0.0;
        auVar32._20_4_ = auVar9._20_4_ * 0.0;
        auVar32._24_4_ = auVar9._24_4_ * 0.0;
        auVar32._28_4_ = 0;
        auVar33._4_4_ = -auVar98._4_4_ * fVar108;
        auVar33._0_4_ = -auVar98._0_4_ * fVar128;
        auVar33._8_4_ = -auVar98._8_4_ * fVar109;
        auVar33._12_4_ = -auVar98._12_4_ * fVar110;
        auVar33._16_4_ = -auVar98._16_4_ * 0.0;
        auVar33._20_4_ = -auVar98._20_4_ * 0.0;
        auVar33._24_4_ = -auVar98._24_4_ * 0.0;
        auVar33._28_4_ = auVar9._28_4_;
        auVar34._28_4_ = auVar106._28_4_;
        auVar34._0_28_ =
             ZEXT1628(CONCAT412(fVar110 * 0.0,
                                CONCAT48(fVar109 * 0.0,CONCAT44(fVar108 * 0.0,fVar128 * 0.0))));
        auVar95 = vfmadd213ps_fma(auVar28,ZEXT1632(auVar20),auVar118);
        auVar98 = ZEXT1632(auVar20);
        auVar130 = vfmadd213ps_fma(auVar29,auVar98,auVar209);
        auVar116 = vfmadd213ps_fma(auVar30,auVar98,ZEXT1632(auVar19));
        auVar117 = vfnmadd213ps_fma(auVar28,auVar98,auVar118);
        auVar94 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar96),auVar99);
        auVar143 = vfnmadd213ps_fma(auVar29,auVar98,auVar209);
        auVar176 = ZEXT1632(auVar96);
        auVar96 = vfmadd213ps_fma(auVar33,auVar176,auVar135);
        auVar155 = ZEXT1632(auVar20);
        auVar115 = vfnmadd231ps_fma(ZEXT1632(auVar19),auVar155,auVar30);
        auVar19 = vfmadd213ps_fma(auVar34,auVar176,ZEXT1632(auVar17));
        auVar151 = vfnmadd213ps_fma(auVar32,auVar176,auVar99);
        auVar93 = vfnmadd213ps_fma(auVar33,auVar176,auVar135);
        auVar150 = vfnmadd231ps_fma(ZEXT1632(auVar17),auVar176,auVar34);
        auVar98 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar143));
        auVar106 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar115));
        auVar99._4_4_ = auVar115._4_4_ * auVar98._4_4_;
        auVar99._0_4_ = auVar115._0_4_ * auVar98._0_4_;
        auVar99._8_4_ = auVar115._8_4_ * auVar98._8_4_;
        auVar99._12_4_ = auVar115._12_4_ * auVar98._12_4_;
        auVar99._16_4_ = auVar98._16_4_ * 0.0;
        auVar99._20_4_ = auVar98._20_4_ * 0.0;
        auVar99._24_4_ = auVar98._24_4_ * 0.0;
        auVar99._28_4_ = 0;
        auVar20 = vfmsub231ps_fma(auVar99,ZEXT1632(auVar143),auVar106);
        auVar118._4_4_ = auVar117._4_4_ * auVar106._4_4_;
        auVar118._0_4_ = auVar117._0_4_ * auVar106._0_4_;
        auVar118._8_4_ = auVar117._8_4_ * auVar106._8_4_;
        auVar118._12_4_ = auVar117._12_4_ * auVar106._12_4_;
        auVar118._16_4_ = auVar106._16_4_ * 0.0;
        auVar118._20_4_ = auVar106._20_4_ * 0.0;
        auVar118._24_4_ = auVar106._24_4_ * 0.0;
        auVar118._28_4_ = auVar106._28_4_;
        auVar180 = ZEXT1632(auVar117);
        auVar106 = vsubps_avx(ZEXT1632(auVar94),auVar180);
        auVar17 = vfmsub231ps_fma(auVar118,ZEXT1632(auVar115),auVar106);
        auVar135._4_4_ = auVar143._4_4_ * auVar106._4_4_;
        auVar135._0_4_ = auVar143._0_4_ * auVar106._0_4_;
        auVar135._8_4_ = auVar143._8_4_ * auVar106._8_4_;
        auVar135._12_4_ = auVar143._12_4_ * auVar106._12_4_;
        auVar135._16_4_ = auVar106._16_4_ * 0.0;
        auVar135._20_4_ = auVar106._20_4_ * 0.0;
        auVar135._24_4_ = auVar106._24_4_ * 0.0;
        auVar135._28_4_ = auVar106._28_4_;
        auVar117 = vfmsub231ps_fma(auVar135,auVar180,auVar98);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        auVar139 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,2);
        auVar98 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar95),auVar139);
        auVar106 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar130),auVar139);
        auVar105 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar116),auVar139);
        auVar123 = vblendvps_avx(auVar180,ZEXT1632(auVar94),auVar139);
        auVar204 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar96),auVar139);
        auVar9 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar19),auVar139);
        auVar180 = vblendvps_avx(ZEXT1632(auVar94),auVar180,auVar139);
        auVar100 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar143),auVar139);
        auVar17 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
        auVar22 = vblendvps_avx(ZEXT1632(auVar19),ZEXT1632(auVar115),auVar139);
        auVar169 = vsubps_avx(auVar180,auVar98);
        auVar100 = vsubps_avx(auVar100,auVar106);
        auVar21 = vsubps_avx(auVar22,auVar105);
        auVar99 = vsubps_avx(auVar98,auVar123);
        auVar118 = vsubps_avx(auVar106,auVar204);
        auVar119 = vsubps_avx(auVar105,auVar9);
        auVar209._4_4_ = auVar21._4_4_ * auVar98._4_4_;
        auVar209._0_4_ = auVar21._0_4_ * auVar98._0_4_;
        auVar209._8_4_ = auVar21._8_4_ * auVar98._8_4_;
        auVar209._12_4_ = auVar21._12_4_ * auVar98._12_4_;
        auVar209._16_4_ = auVar21._16_4_ * auVar98._16_4_;
        auVar209._20_4_ = auVar21._20_4_ * auVar98._20_4_;
        auVar209._24_4_ = auVar21._24_4_ * auVar98._24_4_;
        auVar209._28_4_ = auVar22._28_4_;
        auVar19 = vfmsub231ps_fma(auVar209,auVar105,auVar169);
        auVar35._4_4_ = auVar169._4_4_ * auVar106._4_4_;
        auVar35._0_4_ = auVar169._0_4_ * auVar106._0_4_;
        auVar35._8_4_ = auVar169._8_4_ * auVar106._8_4_;
        auVar35._12_4_ = auVar169._12_4_ * auVar106._12_4_;
        auVar35._16_4_ = auVar169._16_4_ * auVar106._16_4_;
        auVar35._20_4_ = auVar169._20_4_ * auVar106._20_4_;
        auVar35._24_4_ = auVar169._24_4_ * auVar106._24_4_;
        auVar35._28_4_ = auVar180._28_4_;
        auVar20 = vfmsub231ps_fma(auVar35,auVar98,auVar100);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
        auVar102._0_4_ = auVar100._0_4_ * auVar105._0_4_;
        auVar102._4_4_ = auVar100._4_4_ * auVar105._4_4_;
        auVar102._8_4_ = auVar100._8_4_ * auVar105._8_4_;
        auVar102._12_4_ = auVar100._12_4_ * auVar105._12_4_;
        auVar102._16_4_ = auVar100._16_4_ * auVar105._16_4_;
        auVar102._20_4_ = auVar100._20_4_ * auVar105._20_4_;
        auVar102._24_4_ = auVar100._24_4_ * auVar105._24_4_;
        auVar102._28_4_ = 0;
        auVar20 = vfmsub231ps_fma(auVar102,auVar106,auVar21);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        auVar103._0_4_ = auVar119._0_4_ * auVar123._0_4_;
        auVar103._4_4_ = auVar119._4_4_ * auVar123._4_4_;
        auVar103._8_4_ = auVar119._8_4_ * auVar123._8_4_;
        auVar103._12_4_ = auVar119._12_4_ * auVar123._12_4_;
        auVar103._16_4_ = auVar119._16_4_ * auVar123._16_4_;
        auVar103._20_4_ = auVar119._20_4_ * auVar123._20_4_;
        auVar103._24_4_ = auVar119._24_4_ * auVar123._24_4_;
        auVar103._28_4_ = 0;
        auVar19 = vfmsub231ps_fma(auVar103,auVar99,auVar9);
        auVar36._4_4_ = auVar118._4_4_ * auVar9._4_4_;
        auVar36._0_4_ = auVar118._0_4_ * auVar9._0_4_;
        auVar36._8_4_ = auVar118._8_4_ * auVar9._8_4_;
        auVar36._12_4_ = auVar118._12_4_ * auVar9._12_4_;
        auVar36._16_4_ = auVar118._16_4_ * auVar9._16_4_;
        auVar36._20_4_ = auVar118._20_4_ * auVar9._20_4_;
        auVar36._24_4_ = auVar118._24_4_ * auVar9._24_4_;
        auVar36._28_4_ = auVar9._28_4_;
        auVar96 = vfmsub231ps_fma(auVar36,auVar204,auVar119);
        auVar37._4_4_ = auVar99._4_4_ * auVar204._4_4_;
        auVar37._0_4_ = auVar99._0_4_ * auVar204._0_4_;
        auVar37._8_4_ = auVar99._8_4_ * auVar204._8_4_;
        auVar37._12_4_ = auVar99._12_4_ * auVar204._12_4_;
        auVar37._16_4_ = auVar99._16_4_ * auVar204._16_4_;
        auVar37._20_4_ = auVar99._20_4_ * auVar204._20_4_;
        auVar37._24_4_ = auVar99._24_4_ * auVar204._24_4_;
        auVar37._28_4_ = auVar204._28_4_;
        auVar95 = vfmsub231ps_fma(auVar37,auVar118,auVar123);
        auVar204 = ZEXT832(0) << 0x20;
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar204,ZEXT1632(auVar19));
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar204,ZEXT1632(auVar96));
        auVar123 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar96));
        auVar123 = vcmpps_avx(auVar123,ZEXT832(0) << 0x20,2);
        auVar19 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
        auVar17 = vpand_avx(auVar17,auVar19);
        auVar123 = vpmovsxwd_avx2(auVar17);
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0x7f,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar123 >> 0xbf,0) == '\0') &&
            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar123[0x1f]) {
LAB_016509d6:
          auVar166 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar188 = ZEXT3264(CONCAT428(local_6e0,
                                        CONCAT424(local_6e0,
                                                  CONCAT420(local_6e0,
                                                            CONCAT416(local_6e0,
                                                                      CONCAT412(local_6e0,
                                                                                CONCAT48(local_6e0,
                                                                                         CONCAT44(
                                                  local_6e0,local_6e0))))))));
        }
        else {
          auVar38._4_4_ = auVar100._4_4_ * auVar119._4_4_;
          auVar38._0_4_ = auVar100._0_4_ * auVar119._0_4_;
          auVar38._8_4_ = auVar100._8_4_ * auVar119._8_4_;
          auVar38._12_4_ = auVar100._12_4_ * auVar119._12_4_;
          auVar38._16_4_ = auVar100._16_4_ * auVar119._16_4_;
          auVar38._20_4_ = auVar100._20_4_ * auVar119._20_4_;
          auVar38._24_4_ = auVar100._24_4_ * auVar119._24_4_;
          auVar38._28_4_ = auVar123._28_4_;
          auVar116 = vfmsub231ps_fma(auVar38,auVar118,auVar21);
          auVar121._0_4_ = auVar99._0_4_ * auVar21._0_4_;
          auVar121._4_4_ = auVar99._4_4_ * auVar21._4_4_;
          auVar121._8_4_ = auVar99._8_4_ * auVar21._8_4_;
          auVar121._12_4_ = auVar99._12_4_ * auVar21._12_4_;
          auVar121._16_4_ = auVar99._16_4_ * auVar21._16_4_;
          auVar121._20_4_ = auVar99._20_4_ * auVar21._20_4_;
          auVar121._24_4_ = auVar99._24_4_ * auVar21._24_4_;
          auVar121._28_4_ = 0;
          auVar130 = vfmsub231ps_fma(auVar121,auVar169,auVar119);
          auVar39._4_4_ = auVar169._4_4_ * auVar118._4_4_;
          auVar39._0_4_ = auVar169._0_4_ * auVar118._0_4_;
          auVar39._8_4_ = auVar169._8_4_ * auVar118._8_4_;
          auVar39._12_4_ = auVar169._12_4_ * auVar118._12_4_;
          auVar39._16_4_ = auVar169._16_4_ * auVar118._16_4_;
          auVar39._20_4_ = auVar169._20_4_ * auVar118._20_4_;
          auVar39._24_4_ = auVar169._24_4_ * auVar118._24_4_;
          auVar39._28_4_ = auVar169._28_4_;
          auVar94 = vfmsub231ps_fma(auVar39,auVar99,auVar100);
          auVar19 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar130),ZEXT1632(auVar94));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT1632(auVar116),auVar204);
          auVar123 = vrcpps_avx(ZEXT1632(auVar95));
          auVar202._8_4_ = 0x3f800000;
          auVar202._0_8_ = &DAT_3f8000003f800000;
          auVar202._12_4_ = 0x3f800000;
          auVar202._16_4_ = 0x3f800000;
          auVar202._20_4_ = 0x3f800000;
          auVar202._24_4_ = 0x3f800000;
          auVar202._28_4_ = 0x3f800000;
          auVar19 = vfnmadd213ps_fma(auVar123,ZEXT1632(auVar95),auVar202);
          auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar123,auVar123);
          auVar40._4_4_ = auVar94._4_4_ * auVar105._4_4_;
          auVar40._0_4_ = auVar94._0_4_ * auVar105._0_4_;
          auVar40._8_4_ = auVar94._8_4_ * auVar105._8_4_;
          auVar40._12_4_ = auVar94._12_4_ * auVar105._12_4_;
          auVar40._16_4_ = auVar105._16_4_ * 0.0;
          auVar40._20_4_ = auVar105._20_4_ * 0.0;
          auVar40._24_4_ = auVar105._24_4_ * 0.0;
          auVar40._28_4_ = auVar105._28_4_;
          auVar130 = vfmadd231ps_fma(auVar40,auVar106,ZEXT1632(auVar130));
          auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),ZEXT1632(auVar116),auVar98);
          fVar128 = auVar19._0_4_;
          fVar108 = auVar19._4_4_;
          fVar109 = auVar19._8_4_;
          fVar110 = auVar19._12_4_;
          auVar41._28_4_ = auVar106._28_4_;
          auVar41._0_28_ =
               ZEXT1628(CONCAT412(fVar110 * auVar130._12_4_,
                                  CONCAT48(fVar109 * auVar130._8_4_,
                                           CONCAT44(fVar108 * auVar130._4_4_,
                                                    fVar128 * auVar130._0_4_))));
          auVar104._4_4_ = uVar91;
          auVar104._0_4_ = uVar91;
          auVar104._8_4_ = uVar91;
          auVar104._12_4_ = uVar91;
          auVar104._16_4_ = uVar91;
          auVar104._20_4_ = uVar91;
          auVar104._24_4_ = uVar91;
          auVar104._28_4_ = uVar91;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar122._4_4_ = uVar5;
          auVar122._0_4_ = uVar5;
          auVar122._8_4_ = uVar5;
          auVar122._12_4_ = uVar5;
          auVar122._16_4_ = uVar5;
          auVar122._20_4_ = uVar5;
          auVar122._24_4_ = uVar5;
          auVar122._28_4_ = uVar5;
          auVar98 = vcmpps_avx(auVar104,auVar41,2);
          auVar106 = vcmpps_avx(auVar41,auVar122,2);
          auVar98 = vandps_avx(auVar106,auVar98);
          auVar19 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
          auVar17 = vpand_avx(auVar17,auVar19);
          auVar98 = vpmovsxwd_avx2(auVar17);
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar98 >> 0x7f,0) == '\0') &&
                (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0xbf,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar98[0x1f]) goto LAB_016509d6;
          auVar98 = vcmpps_avx(auVar204,ZEXT1632(auVar95),4);
          auVar19 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
          auVar17 = vpand_avx(auVar17,auVar19);
          auVar98 = vpmovsxwd_avx2(auVar17);
          auVar166 = ZEXT3264(CONCAT824(uStack_5e8,
                                        CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          auVar188 = ZEXT3264(CONCAT428(local_6e0,
                                        CONCAT424(local_6e0,
                                                  CONCAT420(local_6e0,
                                                            CONCAT416(local_6e0,
                                                                      CONCAT412(local_6e0,
                                                                                CONCAT48(local_6e0,
                                                                                         CONCAT44(
                                                  local_6e0,local_6e0))))))));
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0x7f,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0xbf,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar98[0x1f] < '\0') {
            auVar105 = ZEXT1632(CONCAT412(fVar110 * auVar20._12_4_,
                                          CONCAT48(fVar109 * auVar20._8_4_,
                                                   CONCAT44(fVar108 * auVar20._4_4_,
                                                            fVar128 * auVar20._0_4_))));
            auVar123 = ZEXT1632(CONCAT412(fVar110 * auVar96._12_4_,
                                          CONCAT48(fVar109 * auVar96._8_4_,
                                                   CONCAT44(fVar108 * auVar96._4_4_,
                                                            fVar128 * auVar96._0_4_))));
            auVar156._8_4_ = 0x3f800000;
            auVar156._0_8_ = &DAT_3f8000003f800000;
            auVar156._12_4_ = 0x3f800000;
            auVar156._16_4_ = 0x3f800000;
            auVar156._20_4_ = 0x3f800000;
            auVar156._24_4_ = 0x3f800000;
            auVar156._28_4_ = 0x3f800000;
            auVar106 = vsubps_avx(auVar156,auVar105);
            local_100 = vblendvps_avx(auVar106,auVar105,auVar139);
            auVar106 = vsubps_avx(auVar156,auVar123);
            local_4a0 = vblendvps_avx(auVar106,auVar123,auVar139);
            auVar166 = ZEXT3264(auVar98);
            local_2a0 = auVar41;
          }
        }
        auVar206 = ZEXT3264(_local_720);
        auVar148 = ZEXT3264(auVar162);
        auVar98 = auVar166._0_32_;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0x7f,0) == '\0') &&
              (auVar166 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar98 >> 0xbf,0) == '\0') &&
            (auVar166 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar166[0x1f]) {
          bVar81 = false;
          auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,CONCAT416(
                                                  fVar142,CONCAT412(fVar149,CONCAT48(fVar142,uVar92)
                                                                   ))))));
        }
        else {
          auVar106 = vsubps_avx(auVar176,auVar155);
          auVar17 = vfmadd213ps_fma(auVar106,local_100,auVar155);
          fVar128 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar42._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * fVar128;
          auVar42._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * fVar128;
          auVar42._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * fVar128;
          auVar42._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * fVar128;
          auVar42._16_4_ = fVar128 * 0.0;
          auVar42._20_4_ = fVar128 * 0.0;
          auVar42._24_4_ = fVar128 * 0.0;
          auVar42._28_4_ = 0;
          auVar106 = vcmpps_avx(local_2a0,auVar42,6);
          auVar105 = auVar98 & auVar106;
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar105 >> 0x7f,0) != '\0') ||
                (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0xbf,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar105[0x1f] < '\0') {
            local_380 = vandps_avx(auVar106,auVar98);
            auVar124._8_4_ = 0xbf800000;
            auVar124._0_8_ = 0xbf800000bf800000;
            auVar124._12_4_ = 0xbf800000;
            auVar124._16_4_ = 0xbf800000;
            auVar124._20_4_ = 0xbf800000;
            auVar124._24_4_ = 0xbf800000;
            auVar124._28_4_ = 0xbf800000;
            auVar137._8_4_ = 0x40000000;
            auVar137._0_8_ = 0x4000000040000000;
            auVar137._12_4_ = 0x40000000;
            auVar137._16_4_ = 0x40000000;
            auVar137._20_4_ = 0x40000000;
            auVar137._24_4_ = 0x40000000;
            auVar137._28_4_ = 0x40000000;
            auVar17 = vfmadd213ps_fma(local_4a0,auVar137,auVar124);
            local_440 = local_100;
            local_420 = ZEXT1632(auVar17);
            local_400 = local_2a0;
            local_3e0 = 0;
            local_3c0 = local_610._0_8_;
            uStack_3b8 = local_610._8_8_;
            local_3b0 = local_620._0_8_;
            uStack_3a8 = local_620._8_8_;
            local_3a0 = local_630._0_8_;
            uStack_398 = local_630._8_8_;
            local_4a0 = local_420;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,CONCAT416(
                                                  fVar142,CONCAT412(fVar149,CONCAT48(fVar142,uVar92)
                                                                   ))))));
              if (context->args->filter == (RTCFilterFunctionN)0x0) {
                auVar166 = ZEXT3264(auVar162);
                bVar81 = true;
                if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_0164f525;
              }
              fVar128 = 1.0 / auVar101._0_4_;
              local_360[0] = fVar128 * (local_100._0_4_ + 0.0);
              local_360[1] = fVar128 * (local_100._4_4_ + 1.0);
              local_360[2] = fVar128 * (local_100._8_4_ + 2.0);
              local_360[3] = fVar128 * (local_100._12_4_ + 3.0);
              fStack_350 = fVar128 * (local_100._16_4_ + 4.0);
              fStack_34c = fVar128 * (local_100._20_4_ + 5.0);
              fStack_348 = fVar128 * (local_100._24_4_ + 6.0);
              fStack_344 = local_100._28_4_ + 7.0;
              local_4a0._0_8_ = auVar17._0_8_;
              local_4a0._8_8_ = auVar17._8_8_;
              local_340 = local_4a0._0_8_;
              uStack_338 = local_4a0._8_8_;
              uStack_330 = 0;
              uStack_328 = 0;
              local_320 = local_2a0._0_8_;
              uStack_318 = local_2a0._8_8_;
              uStack_310 = local_2a0._16_8_;
              uStack_308 = local_2a0._24_8_;
              uVar83 = vmovmskps_avx(local_380);
              bVar81 = uVar83 != 0;
              if (uVar83 == 0) {
                auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,CONCAT416(
                                                  fVar142,CONCAT412(fVar149,CONCAT48(fVar142,uVar92)
                                                                   ))))));
              }
              else {
                uVar84 = 0;
                uVar86 = (ulong)(uVar83 & 0xff);
                for (uVar25 = uVar86; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
                {
                  uVar84 = uVar84 + 1;
                }
                local_6c0._4_4_ = uVar85;
                local_6c0._0_4_ = uVar85;
                local_6c0._8_4_ = uVar85;
                local_6c0._12_4_ = uVar85;
                local_6c0._16_4_ = uVar85;
                local_6c0._20_4_ = uVar85;
                local_6c0._24_4_ = uVar85;
                local_6c0._28_4_ = uVar85;
                local_680._0_4_ = local_680._4_4_;
                local_680._8_4_ = local_680._4_4_;
                local_680._12_4_ = local_680._4_4_;
                local_680._16_4_ = local_680._4_4_;
                local_680._20_4_ = local_680._4_4_;
                local_680._24_4_ = local_680._4_4_;
                local_680._28_4_ = local_680._4_4_;
                local_520._16_16_ = auVar16._16_16_;
                local_520._0_16_ = local_610;
                local_540 = ZEXT1632(local_620);
                auStack_550 = auVar107._16_16_;
                _local_560 = local_630;
                _local_700 = auVar162;
                local_3dc = iVar82;
                local_3d0 = uVar74;
                uStack_3c8 = uVar75;
                do {
                  uVar5 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_220 = local_360[uVar84];
                  uVar6 = *(undefined4 *)((long)&local_340 + uVar84 * 4);
                  local_200._4_4_ = uVar6;
                  local_200._0_4_ = uVar6;
                  local_200._8_4_ = uVar6;
                  local_200._12_4_ = uVar6;
                  local_200._16_4_ = uVar6;
                  local_200._20_4_ = uVar6;
                  local_200._24_4_ = uVar6;
                  local_200._28_4_ = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)((long)&local_320 + uVar84 * 4);
                  fVar109 = 1.0 - local_220;
                  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar109 * fVar109)),
                                            ZEXT416((uint)(local_220 * fVar109)),ZEXT416(0xc0000000)
                                           );
                  auVar17 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar109)),
                                            ZEXT416((uint)(local_220 * local_220)),
                                            ZEXT416(0x40000000));
                  fVar128 = auVar17._0_4_ * 3.0;
                  fVar108 = local_220 * local_220 * 3.0;
                  auVar160._0_4_ = fVar108 * (float)local_560._0_4_;
                  auVar160._4_4_ = fVar108 * (float)local_560._4_4_;
                  auVar160._8_4_ = fVar108 * fStack_558;
                  auVar160._12_4_ = fVar108 * fStack_554;
                  auVar131._4_4_ = fVar128;
                  auVar131._0_4_ = fVar128;
                  auVar131._8_4_ = fVar128;
                  auVar131._12_4_ = fVar128;
                  auVar17 = vfmadd132ps_fma(auVar131,auVar160,local_540._0_16_);
                  fVar128 = auVar19._0_4_ * 3.0;
                  auVar153._4_4_ = fVar128;
                  auVar153._0_4_ = fVar128;
                  auVar153._8_4_ = fVar128;
                  auVar153._12_4_ = fVar128;
                  auVar17 = vfmadd132ps_fma(auVar153,auVar17,local_520._0_16_);
                  fVar128 = fVar109 * fVar109 * -3.0;
                  local_750.context = context->user;
                  auVar132._4_4_ = fVar128;
                  auVar132._0_4_ = fVar128;
                  auVar132._8_4_ = fVar128;
                  auVar132._12_4_ = fVar128;
                  auVar19 = vfmadd132ps_fma(auVar132,auVar17,auVar14);
                  local_280 = auVar19._0_4_;
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  auVar17 = vmovshdup_avx(auVar19);
                  local_260 = auVar17._0_8_;
                  uStack_258 = local_260;
                  uStack_250 = local_260;
                  uStack_248 = local_260;
                  auVar17 = vshufps_avx(auVar19,auVar19,0xaa);
                  local_240 = auVar17._0_8_;
                  uStack_238 = local_240;
                  uStack_230 = local_240;
                  uStack_228 = local_240;
                  fStack_21c = local_220;
                  fStack_218 = local_220;
                  fStack_214 = local_220;
                  fStack_210 = local_220;
                  fStack_20c = local_220;
                  fStack_208 = local_220;
                  fStack_204 = local_220;
                  local_1e0 = local_680._0_8_;
                  uStack_1d8 = local_680._8_8_;
                  uStack_1d0 = local_680._16_8_;
                  uStack_1c8 = local_680._24_8_;
                  local_1c0 = local_6c0;
                  auVar98 = vpcmpeqd_avx2(local_200,local_200);
                  local_1a0 = (local_750.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_750.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_660 = local_2c0._0_8_;
                  uStack_658 = local_2c0._8_8_;
                  uStack_650 = local_2c0._16_8_;
                  uStack_648 = local_2c0._24_8_;
                  local_750.valid = (int *)&local_660;
                  local_750.geometryUserPtr = *(void **)(CONCAT44(uStack_5dc,local_5e0) + 0x18);
                  local_750.hit = (RTCHitN *)&local_280;
                  local_750.N = 8;
                  pcVar12 = *(code **)(CONCAT44(uStack_5dc,local_5e0) + 0x48);
                  local_750.ray = (RTCRayN *)ray;
                  if (pcVar12 != (code *)0x0) {
                    (*pcVar12)(&local_750);
                    auVar166._8_56_ = extraout_var;
                    auVar166._0_8_ = extraout_XMM1_Qa;
                    auVar206 = ZEXT3264(_local_720);
                    auVar148 = ZEXT3264(_local_700);
                    auVar188 = ZEXT3264(CONCAT428(fStack_6c4,
                                                  CONCAT424(fStack_6c8,
                                                            CONCAT420(fStack_6cc,
                                                                      CONCAT416(fStack_6d0,
                                                                                CONCAT412(fStack_6d4
                                                                                          ,CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
                    auVar98 = vpcmpeqd_avx2(auVar166._0_32_,auVar166._0_32_);
                  }
                  auVar107._8_8_ = uStack_658;
                  auVar107._0_8_ = local_660;
                  auVar107._16_8_ = uStack_650;
                  auVar107._24_8_ = uStack_648;
                  auVar105 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar107);
                  auVar106 = auVar98 & ~auVar105;
                  if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar106 >> 0x7f,0) == '\0') &&
                        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar106 >> 0xbf,0) == '\0') &&
                      (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar106[0x1f]) {
                    auVar105 = auVar105 ^ auVar98;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_5dc,local_5e0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var13)(&local_750);
                      auVar206 = ZEXT3264(_local_720);
                      auVar148 = ZEXT3264(_local_700);
                      auVar188 = ZEXT3264(CONCAT428(fStack_6c4,
                                                    CONCAT424(fStack_6c8,
                                                              CONCAT420(fStack_6cc,
                                                                        CONCAT416(fStack_6d0,
                                                                                  CONCAT412(
                                                  fStack_6d4,
                                                  CONCAT48(fStack_6d8,CONCAT44(fStack_6dc,local_6e0)
                                                          )))))));
                    }
                    auVar76._8_8_ = uStack_658;
                    auVar76._0_8_ = local_660;
                    auVar76._16_8_ = uStack_650;
                    auVar76._24_8_ = uStack_648;
                    auVar106 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                    auVar98 = vpcmpeqd_avx2(auVar106,auVar76);
                    auVar105 = vpcmpeqd_avx2(auVar106,auVar106);
                    auVar105 = auVar98 ^ auVar105;
                    auVar138._8_4_ = 0xff800000;
                    auVar138._0_8_ = 0xff800000ff800000;
                    auVar138._12_4_ = 0xff800000;
                    auVar138._16_4_ = 0xff800000;
                    auVar138._20_4_ = 0xff800000;
                    auVar138._24_4_ = 0xff800000;
                    auVar138._28_4_ = 0xff800000;
                    auVar98 = vblendvps_avx(auVar138,*(undefined1 (*) [32])(local_750.ray + 0x100),
                                            auVar98);
                    *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar98;
                  }
                  auVar162 = auVar148._0_32_;
                  auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,
                                                  CONCAT416(fVar142,CONCAT412(fVar149,CONCAT48(
                                                  fVar142,uVar92)))))));
                  if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar105 >> 0x7f,0) != '\0') ||
                        (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar105 >> 0xbf,0) != '\0') ||
                      (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar105[0x1f] < '\0') break;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
                  uVar25 = uVar84 & 0x3f;
                  uVar84 = 0;
                  uVar86 = uVar86 ^ 1L << uVar25;
                  for (uVar25 = uVar86; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000
                      ) {
                    uVar84 = uVar84 + 1;
                  }
                  bVar81 = uVar86 != 0;
                } while (bVar81);
              }
              goto LAB_0164f521;
            }
          }
          bVar81 = false;
          auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,CONCAT416(
                                                  fVar142,CONCAT412(fVar149,CONCAT48(fVar142,uVar92)
                                                                   ))))));
        }
LAB_0164f521:
        auVar166 = ZEXT3264(auVar162);
      }
LAB_0164f525:
      auVar148 = ZEXT3264(local_6a0);
      if (8 < iVar82) {
        _local_700 = auVar166._0_32_;
        local_540._4_4_ = iVar82;
        local_540._0_4_ = iVar82;
        local_540._8_4_ = iVar82;
        local_540._12_4_ = iVar82;
        local_540._16_4_ = iVar82;
        local_540._20_4_ = iVar82;
        local_540._24_4_ = iVar82;
        local_540._28_4_ = iVar82;
        local_480._4_4_ = fVar129;
        local_480._0_4_ = fVar129;
        fStack_478 = fVar129;
        fStack_474 = fVar129;
        fStack_470 = fVar129;
        fStack_46c = fVar129;
        fStack_468 = fVar129;
        fStack_464 = fVar129;
        local_160 = 1.0 / (float)local_5a0._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_120 = uVar85;
        uStack_11c = uVar85;
        uStack_118 = uVar85;
        uStack_114 = uVar85;
        uStack_110 = uVar85;
        uStack_10c = uVar85;
        uStack_108 = uVar85;
        uStack_104 = uVar85;
        local_140 = local_5c0._0_4_;
        uStack_13c = local_5c0._0_4_;
        uStack_138 = local_5c0._0_4_;
        uStack_134 = local_5c0._0_4_;
        uStack_130 = local_5c0._0_4_;
        uStack_12c = local_5c0._0_4_;
        uStack_128 = local_5c0._0_4_;
        uStack_124 = local_5c0._0_4_;
        lVar88 = 8;
        _local_720 = auVar206._0_32_;
        local_5e0 = uVar91;
        uStack_5dc = uVar91;
        uStack_5d8 = uVar91;
        uStack_5d4 = uVar91;
        uStack_5d0 = uVar91;
        uStack_5cc = uVar91;
        uStack_5c8 = uVar91;
        uStack_5c4 = uVar91;
        do {
          auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 * 4 + lVar23);
          auVar106 = *(undefined1 (*) [32])(lVar23 + 0x2227768 + lVar88 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar23 + 0x2227bec + lVar88 * 4);
          pauVar3 = (undefined1 (*) [32])(lVar23 + 0x2228070 + lVar88 * 4);
          auVar80 = *(undefined1 (*) [28])*pauVar3;
          fVar182 = auVar188._0_4_;
          auVar207._0_4_ = fVar182 * *(float *)*pauVar3;
          fVar189 = auVar188._4_4_;
          auVar207._4_4_ = fVar189 * *(float *)(*pauVar3 + 4);
          fVar190 = auVar188._8_4_;
          auVar207._8_4_ = fVar190 * *(float *)(*pauVar3 + 8);
          fVar191 = auVar188._12_4_;
          auVar207._12_4_ = fVar191 * *(float *)(*pauVar3 + 0xc);
          fVar192 = auVar188._16_4_;
          auVar207._16_4_ = fVar192 * *(float *)(*pauVar3 + 0x10);
          fVar193 = auVar188._20_4_;
          auVar207._20_4_ = fVar193 * *(float *)(*pauVar3 + 0x14);
          fVar194 = auVar188._24_4_;
          auVar207._28_36_ = auVar206._28_36_;
          auVar207._24_4_ = fVar194 * *(float *)(*pauVar3 + 0x18);
          auVar206._0_4_ = auVar126._0_4_ * *(float *)*pauVar3;
          auVar206._4_4_ = auVar126._4_4_ * *(float *)(*pauVar3 + 4);
          auVar206._8_4_ = auVar126._8_4_ * *(float *)(*pauVar3 + 8);
          auVar206._12_4_ = auVar126._12_4_ * *(float *)(*pauVar3 + 0xc);
          auVar206._16_4_ = auVar126._16_4_ * *(float *)(*pauVar3 + 0x10);
          auVar206._20_4_ = auVar126._20_4_ * *(float *)(*pauVar3 + 0x14);
          auVar206._28_36_ = auVar166._28_36_;
          auVar206._24_4_ = auVar126._24_4_ * *(float *)(*pauVar3 + 0x18);
          auVar14 = vfmadd231ps_fma(auVar207._0_32_,auVar105,auVar148._0_32_);
          auVar17 = vfmadd231ps_fma(auVar206._0_32_,auVar105,auVar200);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar106,auVar212);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar106,local_500);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar98,auVar184);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar98,local_580);
          auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 * 4 + lVar23);
          auVar204 = *(undefined1 (*) [32])(lVar23 + 0x2229b88 + lVar88 * 4);
          auVar9 = *(undefined1 (*) [32])(lVar23 + 0x222a00c + lVar88 * 4);
          pfVar4 = (float *)(lVar23 + 0x222a490 + lVar88 * 4);
          fVar113 = *pfVar4;
          fVar127 = pfVar4[1];
          fVar208 = pfVar4[2];
          fVar215 = pfVar4[3];
          fVar216 = pfVar4[4];
          fVar217 = pfVar4[5];
          fVar218 = pfVar4[6];
          auVar43._4_4_ = fVar189 * fVar127;
          auVar43._0_4_ = fVar182 * fVar113;
          auVar43._8_4_ = fVar190 * fVar208;
          auVar43._12_4_ = fVar191 * fVar215;
          auVar43._16_4_ = fVar192 * fVar216;
          auVar43._20_4_ = fVar193 * fVar217;
          auVar43._24_4_ = fVar194 * fVar218;
          auVar43._28_4_ = auVar105._28_4_;
          auVar44._4_4_ = fVar127 * auVar126._4_4_;
          auVar44._0_4_ = fVar113 * auVar126._0_4_;
          auVar44._8_4_ = fVar208 * auVar126._8_4_;
          auVar44._12_4_ = fVar215 * auVar126._12_4_;
          auVar44._16_4_ = fVar216 * auVar126._16_4_;
          auVar44._20_4_ = fVar217 * auVar126._20_4_;
          auVar44._24_4_ = fVar218 * auVar126._24_4_;
          auVar44._28_4_ = auVar98._28_4_;
          auVar19 = vfmadd231ps_fma(auVar43,auVar9,auVar148._0_32_);
          auVar20 = vfmadd231ps_fma(auVar44,auVar9,auVar200);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar204,auVar212);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar204,local_500);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar123,auVar184);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar123,local_580);
          auVar169 = ZEXT1632(auVar19);
          _local_5c0 = ZEXT1632(auVar14);
          auVar16 = vsubps_avx(auVar169,_local_5c0);
          auVar139 = ZEXT1632(auVar20);
          local_5a0 = ZEXT1632(auVar17);
          auVar107 = vsubps_avx(auVar139,local_5a0);
          auVar73._4_4_ = auVar16._4_4_ * auVar17._4_4_;
          auVar73._0_4_ = auVar16._0_4_ * auVar17._0_4_;
          auVar73._8_4_ = auVar16._8_4_ * auVar17._8_4_;
          auVar73._12_4_ = auVar16._12_4_ * auVar17._12_4_;
          auVar73._16_4_ = auVar16._16_4_ * 0.0;
          auVar73._20_4_ = auVar16._20_4_ * 0.0;
          auVar73._24_4_ = auVar16._24_4_ * 0.0;
          auVar73._28_4_ = local_500._28_4_;
          auVar166 = ZEXT3264(auVar105);
          fVar129 = auVar107._0_4_;
          auVar148._0_4_ = auVar14._0_4_ * fVar129;
          fVar128 = auVar107._4_4_;
          auVar148._4_4_ = auVar14._4_4_ * fVar128;
          fVar108 = auVar107._8_4_;
          auVar148._8_4_ = auVar14._8_4_ * fVar108;
          fVar109 = auVar107._12_4_;
          auVar148._12_4_ = auVar14._12_4_ * fVar109;
          fVar110 = auVar107._16_4_;
          auVar148._16_4_ = fVar110 * 0.0;
          fVar111 = auVar107._20_4_;
          auVar148._20_4_ = fVar111 * 0.0;
          fVar112 = auVar107._24_4_;
          auVar148._28_36_ = auVar126._28_36_;
          auVar148._24_4_ = fVar112 * 0.0;
          auVar206 = ZEXT3264(*pauVar3);
          auVar100 = vsubps_avx(auVar73,auVar148._0_32_);
          auVar170._0_4_ = auVar80._0_4_ * (float)local_e0;
          auVar170._4_4_ = auVar80._4_4_ * local_e0._4_4_;
          auVar170._8_4_ = auVar80._8_4_ * (float)uStack_d8;
          auVar170._12_4_ = auVar80._12_4_ * uStack_d8._4_4_;
          auVar170._16_4_ = auVar80._16_4_ * (float)uStack_d0;
          auVar170._20_4_ = auVar80._20_4_ * uStack_d0._4_4_;
          auVar170._24_4_ = auVar80._24_4_ * (float)uStack_c8;
          auVar170._28_4_ = 0;
          auVar14 = vfmadd231ps_fma(auVar170,auVar105,local_c0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar106,local_a0);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_80,auVar98);
          auVar45._4_4_ = fVar127 * local_e0._4_4_;
          auVar45._0_4_ = fVar113 * (float)local_e0;
          auVar45._8_4_ = fVar208 * (float)uStack_d8;
          auVar45._12_4_ = fVar215 * uStack_d8._4_4_;
          auVar45._16_4_ = fVar216 * (float)uStack_d0;
          auVar45._20_4_ = fVar217 * uStack_d0._4_4_;
          auVar45._24_4_ = fVar218 * (float)uStack_c8;
          auVar45._28_4_ = auVar106._28_4_;
          auVar17 = vfmadd231ps_fma(auVar45,auVar9,local_c0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar204,local_a0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar123,local_80);
          auVar126._0_4_ = fVar129 * fVar129;
          auVar126._4_4_ = fVar128 * fVar128;
          auVar126._8_4_ = fVar108 * fVar108;
          auVar126._12_4_ = fVar109 * fVar109;
          auVar126._16_4_ = fVar110 * fVar110;
          auVar126._20_4_ = fVar111 * fVar111;
          auVar126._28_36_ = auVar188._28_36_;
          auVar126._24_4_ = fVar112 * fVar112;
          auVar19 = vfmadd231ps_fma(auVar126._0_32_,auVar16,auVar16);
          local_520 = ZEXT1632(auVar17);
          auVar180 = vmaxps_avx(ZEXT1632(auVar14),local_520);
          auVar185._0_4_ = auVar180._0_4_ * auVar180._0_4_ * auVar19._0_4_;
          auVar185._4_4_ = auVar180._4_4_ * auVar180._4_4_ * auVar19._4_4_;
          auVar185._8_4_ = auVar180._8_4_ * auVar180._8_4_ * auVar19._8_4_;
          auVar185._12_4_ = auVar180._12_4_ * auVar180._12_4_ * auVar19._12_4_;
          auVar185._16_4_ = auVar180._16_4_ * auVar180._16_4_ * 0.0;
          auVar185._20_4_ = auVar180._20_4_ * auVar180._20_4_ * 0.0;
          auVar185._24_4_ = auVar180._24_4_ * auVar180._24_4_ * 0.0;
          auVar185._28_4_ = 0;
          auVar46._4_4_ = auVar100._4_4_ * auVar100._4_4_;
          auVar46._0_4_ = auVar100._0_4_ * auVar100._0_4_;
          auVar46._8_4_ = auVar100._8_4_ * auVar100._8_4_;
          auVar46._12_4_ = auVar100._12_4_ * auVar100._12_4_;
          auVar46._16_4_ = auVar100._16_4_ * auVar100._16_4_;
          auVar46._20_4_ = auVar100._20_4_ * auVar100._20_4_;
          auVar46._24_4_ = auVar100._24_4_ * auVar100._24_4_;
          auVar46._28_4_ = auVar100._28_4_;
          auVar180 = vcmpps_avx(auVar46,auVar185,2);
          local_3e0 = (int)lVar88;
          auVar186._4_4_ = local_3e0;
          auVar186._0_4_ = local_3e0;
          auVar186._8_4_ = local_3e0;
          auVar186._12_4_ = local_3e0;
          auVar186._16_4_ = local_3e0;
          auVar186._20_4_ = local_3e0;
          auVar186._24_4_ = local_3e0;
          auVar186._28_4_ = local_3e0;
          auVar100 = vpor_avx2(auVar186,_DAT_0205a920);
          auVar22 = vpcmpgtd_avx2(local_540,auVar100);
          auVar100 = auVar22 & auVar180;
          if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar100 >> 0x7f,0) == '\0') &&
                (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar100 >> 0xbf,0) == '\0') &&
              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar100[0x1f]) {
            auVar148 = ZEXT3264(local_6a0);
            auVar188 = ZEXT3264(auVar188._0_32_);
            auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,CONCAT416(
                                                  fVar142,CONCAT412(fVar149,CONCAT48(fVar142,uVar92)
                                                                   ))))));
          }
          else {
            _local_560 = vandps_avx(auVar22,auVar180);
            auVar47._4_4_ = (float)local_720._4_4_ * fVar127;
            auVar47._0_4_ = (float)local_720._0_4_ * fVar113;
            auVar47._8_4_ = fStack_718 * fVar208;
            auVar47._12_4_ = fStack_714 * fVar215;
            auVar47._16_4_ = fStack_710 * fVar216;
            auVar47._20_4_ = fStack_70c * fVar217;
            auVar47._24_4_ = fStack_708 * fVar218;
            auVar47._28_4_ = auVar180._28_4_;
            auVar17 = vfmadd213ps_fma(auVar9,_local_700,auVar47);
            auVar17 = vfmadd213ps_fma(auVar204,local_4e0,ZEXT1632(auVar17));
            auVar17 = vfmadd132ps_fma(auVar123,ZEXT1632(auVar17),auVar144);
            auVar48._4_4_ = (float)local_720._4_4_ * auVar80._4_4_;
            auVar48._0_4_ = (float)local_720._0_4_ * auVar80._0_4_;
            auVar48._8_4_ = fStack_718 * auVar80._8_4_;
            auVar48._12_4_ = fStack_714 * auVar80._12_4_;
            auVar48._16_4_ = fStack_710 * auVar80._16_4_;
            auVar48._20_4_ = fStack_70c * auVar80._20_4_;
            auVar48._24_4_ = fStack_708 * auVar80._24_4_;
            auVar48._28_4_ = auVar180._28_4_;
            auVar19 = vfmadd213ps_fma(auVar105,_local_700,auVar48);
            auVar19 = vfmadd213ps_fma(auVar106,local_4e0,ZEXT1632(auVar19));
            auVar106 = *(undefined1 (*) [32])(lVar23 + 0x22284f4 + lVar88 * 4);
            auVar105 = *(undefined1 (*) [32])(lVar23 + 0x2228978 + lVar88 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar23 + 0x2228dfc + lVar88 * 4);
            pfVar4 = (float *)(lVar23 + 0x2229280 + lVar88 * 4);
            fVar129 = *pfVar4;
            fVar128 = pfVar4[1];
            fVar108 = pfVar4[2];
            fVar109 = pfVar4[3];
            fVar110 = pfVar4[4];
            fVar111 = pfVar4[5];
            fVar112 = pfVar4[6];
            auVar49._4_4_ = fVar128 * fVar189;
            auVar49._0_4_ = fVar129 * fVar182;
            auVar49._8_4_ = fVar108 * fVar190;
            auVar49._12_4_ = fVar109 * fVar191;
            auVar49._16_4_ = fVar110 * fVar192;
            auVar49._20_4_ = fVar111 * fVar193;
            auVar49._24_4_ = fVar112 * fVar194;
            auVar49._28_4_ = local_4e0._28_4_;
            auVar50._4_4_ = fVar128 * fVar149;
            auVar50._0_4_ = fVar129 * fVar142;
            auVar50._8_4_ = fVar108 * fVar142;
            auVar50._12_4_ = fVar109 * fVar149;
            auVar50._16_4_ = fVar110 * fVar142;
            auVar50._20_4_ = fVar111 * fVar149;
            auVar50._24_4_ = fVar112 * fVar142;
            auVar50._28_4_ = *(undefined4 *)(*pauVar3 + 0x1c);
            auVar51._4_4_ = (float)local_720._4_4_ * fVar128;
            auVar51._0_4_ = (float)local_720._0_4_ * fVar129;
            auVar51._8_4_ = fStack_718 * fVar108;
            auVar51._12_4_ = fStack_714 * fVar109;
            auVar51._16_4_ = fStack_710 * fVar110;
            auVar51._20_4_ = fStack_70c * fVar111;
            auVar51._24_4_ = fStack_708 * fVar112;
            auVar51._28_4_ = pfVar4[7];
            auVar96 = vfmadd231ps_fma(auVar49,auVar123,local_6a0);
            auVar95 = vfmadd231ps_fma(auVar50,auVar123,auVar200);
            auVar130 = vfmadd231ps_fma(auVar51,_local_700,auVar123);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar105,auVar212);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar105,local_500);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),local_4e0,auVar105);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar106,auVar184);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar106,local_580);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar106,auVar144);
            pfVar4 = (float *)(lVar23 + 0x222b6a0 + lVar88 * 4);
            fVar129 = *pfVar4;
            fVar128 = pfVar4[1];
            fVar108 = pfVar4[2];
            fVar109 = pfVar4[3];
            fVar110 = pfVar4[4];
            fVar111 = pfVar4[5];
            fVar112 = pfVar4[6];
            auVar52._4_4_ = fVar189 * fVar128;
            auVar52._0_4_ = fVar182 * fVar129;
            auVar52._8_4_ = fVar190 * fVar108;
            auVar52._12_4_ = fVar191 * fVar109;
            auVar52._16_4_ = fVar192 * fVar110;
            auVar52._20_4_ = fVar193 * fVar111;
            auVar52._24_4_ = fVar194 * fVar112;
            auVar52._28_4_ = auVar16._28_4_;
            auVar53._4_4_ = fVar149 * fVar128;
            auVar53._0_4_ = fVar142 * fVar129;
            auVar53._8_4_ = fVar142 * fVar108;
            auVar53._12_4_ = fVar149 * fVar109;
            auVar53._16_4_ = fVar142 * fVar110;
            auVar53._20_4_ = fVar149 * fVar111;
            auVar53._24_4_ = fVar142 * fVar112;
            auVar53._28_4_ = auVar107._28_4_;
            auVar54._4_4_ = fVar128 * (float)local_720._4_4_;
            auVar54._0_4_ = fVar129 * (float)local_720._0_4_;
            auVar54._8_4_ = fVar108 * fStack_718;
            auVar54._12_4_ = fVar109 * fStack_714;
            auVar54._16_4_ = fVar110 * fStack_710;
            auVar54._20_4_ = fVar111 * fStack_70c;
            auVar54._24_4_ = fVar112 * fStack_708;
            auVar54._28_4_ = pfVar4[7];
            auVar106 = *(undefined1 (*) [32])(lVar23 + 0x222b21c + lVar88 * 4);
            auVar116 = vfmadd231ps_fma(auVar52,auVar106,local_6a0);
            auVar94 = vfmadd231ps_fma(auVar53,auVar106,auVar200);
            auVar117 = vfmadd231ps_fma(auVar54,_local_700,auVar106);
            auVar106 = *(undefined1 (*) [32])(lVar23 + 0x222ad98 + lVar88 * 4);
            auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar106,auVar212);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,local_500);
            auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar106,local_4e0);
            auVar106 = *(undefined1 (*) [32])(lVar23 + 0x222a914 + lVar88 * 4);
            auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar106,auVar184);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar106,local_580);
            auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar144,auVar106);
            auVar187._8_4_ = 0x7fffffff;
            auVar187._0_8_ = 0x7fffffff7fffffff;
            auVar187._12_4_ = 0x7fffffff;
            auVar187._16_4_ = 0x7fffffff;
            auVar187._20_4_ = 0x7fffffff;
            auVar187._24_4_ = 0x7fffffff;
            auVar187._28_4_ = 0x7fffffff;
            auVar106 = vandps_avx(ZEXT1632(auVar96),auVar187);
            auVar105 = vandps_avx(ZEXT1632(auVar95),auVar187);
            auVar105 = vmaxps_avx(auVar106,auVar105);
            auVar106 = vandps_avx(ZEXT1632(auVar130),auVar187);
            auVar106 = vmaxps_avx(auVar105,auVar106);
            auVar106 = vcmpps_avx(auVar106,_local_480,1);
            auVar123 = vblendvps_avx(ZEXT1632(auVar96),auVar16,auVar106);
            auVar204 = vblendvps_avx(ZEXT1632(auVar95),auVar107,auVar106);
            auVar106 = vandps_avx(ZEXT1632(auVar116),auVar187);
            auVar105 = vandps_avx(ZEXT1632(auVar94),auVar187);
            auVar105 = vmaxps_avx(auVar106,auVar105);
            auVar106 = vandps_avx(auVar187,ZEXT1632(auVar117));
            auVar106 = vmaxps_avx(auVar105,auVar106);
            auVar105 = vcmpps_avx(auVar106,_local_480,1);
            auVar106 = vblendvps_avx(ZEXT1632(auVar116),auVar16,auVar105);
            auVar105 = vblendvps_avx(ZEXT1632(auVar94),auVar107,auVar105);
            auVar19 = vfmadd213ps_fma(auVar98,auVar144,ZEXT1632(auVar19));
            auVar96 = vfmadd213ps_fma(auVar123,auVar123,ZEXT832(0) << 0x20);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar204,auVar204);
            auVar98 = vrsqrtps_avx(ZEXT1632(auVar96));
            fVar129 = auVar98._0_4_;
            fVar128 = auVar98._4_4_;
            fVar108 = auVar98._8_4_;
            fVar109 = auVar98._12_4_;
            fVar110 = auVar98._16_4_;
            fVar111 = auVar98._20_4_;
            fVar112 = auVar98._24_4_;
            auVar55._4_4_ = fVar128 * fVar128 * fVar128 * auVar96._4_4_ * -0.5;
            auVar55._0_4_ = fVar129 * fVar129 * fVar129 * auVar96._0_4_ * -0.5;
            auVar55._8_4_ = fVar108 * fVar108 * fVar108 * auVar96._8_4_ * -0.5;
            auVar55._12_4_ = fVar109 * fVar109 * fVar109 * auVar96._12_4_ * -0.5;
            auVar55._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar55._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar55._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
            auVar55._28_4_ = 0;
            auVar214._8_4_ = 0x3fc00000;
            auVar214._0_8_ = 0x3fc000003fc00000;
            auVar214._12_4_ = 0x3fc00000;
            auVar214._16_4_ = 0x3fc00000;
            auVar214._20_4_ = 0x3fc00000;
            auVar214._24_4_ = 0x3fc00000;
            auVar214._28_4_ = 0x3fc00000;
            auVar96 = vfmadd231ps_fma(auVar55,auVar214,auVar98);
            fVar129 = auVar96._0_4_;
            fVar128 = auVar96._4_4_;
            auVar56._4_4_ = auVar204._4_4_ * fVar128;
            auVar56._0_4_ = auVar204._0_4_ * fVar129;
            fVar108 = auVar96._8_4_;
            auVar56._8_4_ = auVar204._8_4_ * fVar108;
            fVar109 = auVar96._12_4_;
            auVar56._12_4_ = auVar204._12_4_ * fVar109;
            auVar56._16_4_ = auVar204._16_4_ * 0.0;
            auVar56._20_4_ = auVar204._20_4_ * 0.0;
            auVar56._24_4_ = auVar204._24_4_ * 0.0;
            auVar56._28_4_ = auVar98._28_4_;
            auVar57._4_4_ = fVar128 * -auVar123._4_4_;
            auVar57._0_4_ = fVar129 * -auVar123._0_4_;
            auVar57._8_4_ = fVar108 * -auVar123._8_4_;
            auVar57._12_4_ = fVar109 * -auVar123._12_4_;
            auVar57._16_4_ = -auVar123._16_4_ * 0.0;
            auVar57._20_4_ = -auVar123._20_4_ * 0.0;
            auVar57._24_4_ = -auVar123._24_4_ * 0.0;
            auVar57._28_4_ = auVar204._28_4_;
            auVar96 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar105,auVar105);
            auVar98 = vrsqrtps_avx(ZEXT1632(auVar96));
            auVar58._28_4_ = auVar18._4_4_;
            auVar58._0_28_ =
                 ZEXT1628(CONCAT412(fVar109 * 0.0,
                                    CONCAT48(fVar108 * 0.0,CONCAT44(fVar128 * 0.0,fVar129 * 0.0))));
            fVar129 = auVar98._0_4_;
            fVar128 = auVar98._4_4_;
            fVar108 = auVar98._8_4_;
            fVar109 = auVar98._12_4_;
            fVar110 = auVar98._16_4_;
            fVar111 = auVar98._20_4_;
            fVar112 = auVar98._24_4_;
            auVar59._4_4_ = fVar128 * fVar128 * fVar128 * auVar96._4_4_ * -0.5;
            auVar59._0_4_ = fVar129 * fVar129 * fVar129 * auVar96._0_4_ * -0.5;
            auVar59._8_4_ = fVar108 * fVar108 * fVar108 * auVar96._8_4_ * -0.5;
            auVar59._12_4_ = fVar109 * fVar109 * fVar109 * auVar96._12_4_ * -0.5;
            auVar59._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar59._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar59._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
            auVar59._28_4_ = 0;
            auVar96 = vfmadd231ps_fma(auVar59,auVar214,auVar98);
            fVar129 = auVar96._0_4_;
            fVar128 = auVar96._4_4_;
            auVar60._4_4_ = auVar105._4_4_ * fVar128;
            auVar60._0_4_ = auVar105._0_4_ * fVar129;
            fVar108 = auVar96._8_4_;
            auVar60._8_4_ = auVar105._8_4_ * fVar108;
            fVar109 = auVar96._12_4_;
            auVar60._12_4_ = auVar105._12_4_ * fVar109;
            auVar60._16_4_ = auVar105._16_4_ * 0.0;
            auVar60._20_4_ = auVar105._20_4_ * 0.0;
            auVar60._24_4_ = auVar105._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar61._4_4_ = fVar128 * -auVar106._4_4_;
            auVar61._0_4_ = fVar129 * -auVar106._0_4_;
            auVar61._8_4_ = fVar108 * -auVar106._8_4_;
            auVar61._12_4_ = fVar109 * -auVar106._12_4_;
            auVar61._16_4_ = -auVar106._16_4_ * 0.0;
            auVar61._20_4_ = -auVar106._20_4_ * 0.0;
            auVar61._24_4_ = -auVar106._24_4_ * 0.0;
            auVar61._28_4_ = auVar98._28_4_;
            auVar62._28_4_ = 0xbf000000;
            auVar62._0_28_ =
                 ZEXT1628(CONCAT412(fVar109 * 0.0,
                                    CONCAT48(fVar108 * 0.0,CONCAT44(fVar128 * 0.0,fVar129 * 0.0))));
            auVar96 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar14),_local_5c0);
            auVar98 = ZEXT1632(auVar14);
            auVar95 = vfmadd213ps_fma(auVar57,auVar98,local_5a0);
            auVar130 = vfmadd213ps_fma(auVar58,auVar98,ZEXT1632(auVar19));
            auVar117 = vfnmadd213ps_fma(auVar56,auVar98,_local_5c0);
            auVar116 = vfmadd213ps_fma(auVar60,local_520,auVar169);
            auVar143 = vfnmadd213ps_fma(auVar57,auVar98,local_5a0);
            auVar94 = vfmadd213ps_fma(auVar61,local_520,auVar139);
            auVar99 = ZEXT1632(auVar14);
            auVar14 = vfnmadd231ps_fma(ZEXT1632(auVar19),auVar99,auVar58);
            auVar19 = vfmadd213ps_fma(auVar62,local_520,ZEXT1632(auVar17));
            auVar151 = vfnmadd213ps_fma(auVar60,local_520,auVar169);
            auVar93 = vfnmadd213ps_fma(auVar61,local_520,auVar139);
            auVar115 = vfnmadd231ps_fma(ZEXT1632(auVar17),local_520,auVar62);
            auVar98 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar143));
            auVar106 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar14));
            auVar171._0_4_ = auVar98._0_4_ * auVar14._0_4_;
            auVar171._4_4_ = auVar98._4_4_ * auVar14._4_4_;
            auVar171._8_4_ = auVar98._8_4_ * auVar14._8_4_;
            auVar171._12_4_ = auVar98._12_4_ * auVar14._12_4_;
            auVar171._16_4_ = auVar98._16_4_ * 0.0;
            auVar171._20_4_ = auVar98._20_4_ * 0.0;
            auVar171._24_4_ = auVar98._24_4_ * 0.0;
            auVar171._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar171,ZEXT1632(auVar143),auVar106);
            auVar63._4_4_ = auVar117._4_4_ * auVar106._4_4_;
            auVar63._0_4_ = auVar117._0_4_ * auVar106._0_4_;
            auVar63._8_4_ = auVar117._8_4_ * auVar106._8_4_;
            auVar63._12_4_ = auVar117._12_4_ * auVar106._12_4_;
            auVar63._16_4_ = auVar106._16_4_ * 0.0;
            auVar63._20_4_ = auVar106._20_4_ * 0.0;
            auVar63._24_4_ = auVar106._24_4_ * 0.0;
            auVar63._28_4_ = auVar106._28_4_;
            auVar180 = ZEXT1632(auVar117);
            auVar106 = vsubps_avx(ZEXT1632(auVar116),auVar180);
            auVar107 = ZEXT1632(auVar14);
            auVar14 = vfmsub231ps_fma(auVar63,auVar107,auVar106);
            auVar64._4_4_ = auVar143._4_4_ * auVar106._4_4_;
            auVar64._0_4_ = auVar143._0_4_ * auVar106._0_4_;
            auVar64._8_4_ = auVar143._8_4_ * auVar106._8_4_;
            auVar64._12_4_ = auVar143._12_4_ * auVar106._12_4_;
            auVar64._16_4_ = auVar106._16_4_ * 0.0;
            auVar64._20_4_ = auVar106._20_4_ * 0.0;
            auVar64._24_4_ = auVar106._24_4_ * 0.0;
            auVar64._28_4_ = auVar106._28_4_;
            auVar117 = vfmsub231ps_fma(auVar64,auVar180,auVar98);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar100 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
            auVar98 = vblendvps_avx(ZEXT1632(auVar151),ZEXT1632(auVar96),auVar100);
            auVar106 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar95),auVar100);
            auVar105 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar130),auVar100);
            auVar123 = vblendvps_avx(auVar180,ZEXT1632(auVar116),auVar100);
            auVar204 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar94),auVar100);
            auVar9 = vblendvps_avx(auVar107,ZEXT1632(auVar19),auVar100);
            auVar180 = vblendvps_avx(ZEXT1632(auVar116),auVar180,auVar100);
            auVar16 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar143),auVar100);
            auVar14 = vpackssdw_avx(local_560._0_16_,local_560._16_16_);
            auVar107 = vblendvps_avx(ZEXT1632(auVar19),auVar107,auVar100);
            auVar180 = vsubps_avx(auVar180,auVar98);
            auVar16 = vsubps_avx(auVar16,auVar106);
            auVar22 = vsubps_avx(auVar107,auVar105);
            auVar206 = ZEXT3264(auVar22);
            auVar139 = vsubps_avx(auVar98,auVar123);
            auVar169 = vsubps_avx(auVar106,auVar204);
            auVar21 = vsubps_avx(auVar105,auVar9);
            auVar163._0_4_ = auVar22._0_4_ * auVar98._0_4_;
            auVar163._4_4_ = auVar22._4_4_ * auVar98._4_4_;
            auVar163._8_4_ = auVar22._8_4_ * auVar98._8_4_;
            auVar163._12_4_ = auVar22._12_4_ * auVar98._12_4_;
            auVar163._16_4_ = auVar22._16_4_ * auVar98._16_4_;
            auVar163._20_4_ = auVar22._20_4_ * auVar98._20_4_;
            auVar163._24_4_ = auVar22._24_4_ * auVar98._24_4_;
            auVar163._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar163,auVar105,auVar180);
            auVar65._4_4_ = auVar180._4_4_ * auVar106._4_4_;
            auVar65._0_4_ = auVar180._0_4_ * auVar106._0_4_;
            auVar65._8_4_ = auVar180._8_4_ * auVar106._8_4_;
            auVar65._12_4_ = auVar180._12_4_ * auVar106._12_4_;
            auVar65._16_4_ = auVar180._16_4_ * auVar106._16_4_;
            auVar65._20_4_ = auVar180._20_4_ * auVar106._20_4_;
            auVar65._24_4_ = auVar180._24_4_ * auVar106._24_4_;
            auVar65._28_4_ = auVar107._28_4_;
            auVar19 = vfmsub231ps_fma(auVar65,auVar98,auVar16);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT1632(auVar17),_DAT_02020f00);
            auVar164._0_4_ = auVar16._0_4_ * auVar105._0_4_;
            auVar164._4_4_ = auVar16._4_4_ * auVar105._4_4_;
            auVar164._8_4_ = auVar16._8_4_ * auVar105._8_4_;
            auVar164._12_4_ = auVar16._12_4_ * auVar105._12_4_;
            auVar164._16_4_ = auVar16._16_4_ * auVar105._16_4_;
            auVar164._20_4_ = auVar16._20_4_ * auVar105._20_4_;
            auVar164._24_4_ = auVar16._24_4_ * auVar105._24_4_;
            auVar164._28_4_ = 0;
            auVar19 = vfmsub231ps_fma(auVar164,auVar106,auVar22);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
            auVar165._0_4_ = auVar21._0_4_ * auVar123._0_4_;
            auVar165._4_4_ = auVar21._4_4_ * auVar123._4_4_;
            auVar165._8_4_ = auVar21._8_4_ * auVar123._8_4_;
            auVar165._12_4_ = auVar21._12_4_ * auVar123._12_4_;
            auVar165._16_4_ = auVar21._16_4_ * auVar123._16_4_;
            auVar165._20_4_ = auVar21._20_4_ * auVar123._20_4_;
            auVar165._24_4_ = auVar21._24_4_ * auVar123._24_4_;
            auVar165._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar165,auVar139,auVar9);
            auVar66._4_4_ = auVar169._4_4_ * auVar9._4_4_;
            auVar66._0_4_ = auVar169._0_4_ * auVar9._0_4_;
            auVar66._8_4_ = auVar169._8_4_ * auVar9._8_4_;
            auVar66._12_4_ = auVar169._12_4_ * auVar9._12_4_;
            auVar66._16_4_ = auVar169._16_4_ * auVar9._16_4_;
            auVar66._20_4_ = auVar169._20_4_ * auVar9._20_4_;
            auVar66._24_4_ = auVar169._24_4_ * auVar9._24_4_;
            auVar66._28_4_ = auVar9._28_4_;
            auVar96 = vfmsub231ps_fma(auVar66,auVar204,auVar21);
            auVar67._4_4_ = auVar139._4_4_ * auVar204._4_4_;
            auVar67._0_4_ = auVar139._0_4_ * auVar204._0_4_;
            auVar67._8_4_ = auVar139._8_4_ * auVar204._8_4_;
            auVar67._12_4_ = auVar139._12_4_ * auVar204._12_4_;
            auVar67._16_4_ = auVar139._16_4_ * auVar204._16_4_;
            auVar67._20_4_ = auVar139._20_4_ * auVar204._20_4_;
            auVar67._24_4_ = auVar139._24_4_ * auVar204._24_4_;
            auVar67._28_4_ = auVar204._28_4_;
            auVar95 = vfmsub231ps_fma(auVar67,auVar169,auVar123);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar96));
            auVar123 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar96));
            auVar123 = vcmpps_avx(auVar123,ZEXT832(0) << 0x20,2);
            auVar17 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
            auVar17 = vpand_avx(auVar17,auVar14);
            auVar123 = vpmovsxwd_avx2(auVar17);
            auVar166 = ZEXT3264(auVar123);
            if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar123 >> 0x7f,0) == '\0') &&
                  (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar123 >> 0xbf,0) == '\0') &&
                (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar123[0x1f]) {
LAB_016509cb:
              auVar147._8_8_ = uStack_5f8;
              auVar147._0_8_ = local_600;
              auVar147._16_8_ = uStack_5f0;
              auVar147._24_8_ = uStack_5e8;
            }
            else {
              auVar68._4_4_ = auVar16._4_4_ * auVar21._4_4_;
              auVar68._0_4_ = auVar16._0_4_ * auVar21._0_4_;
              auVar68._8_4_ = auVar16._8_4_ * auVar21._8_4_;
              auVar68._12_4_ = auVar16._12_4_ * auVar21._12_4_;
              auVar68._16_4_ = auVar16._16_4_ * auVar21._16_4_;
              auVar68._20_4_ = auVar16._20_4_ * auVar21._20_4_;
              auVar68._24_4_ = auVar16._24_4_ * auVar21._24_4_;
              auVar68._28_4_ = auVar123._28_4_;
              auVar94 = vfmsub231ps_fma(auVar68,auVar169,auVar22);
              auVar172._0_4_ = auVar22._0_4_ * auVar139._0_4_;
              auVar172._4_4_ = auVar22._4_4_ * auVar139._4_4_;
              auVar172._8_4_ = auVar22._8_4_ * auVar139._8_4_;
              auVar172._12_4_ = auVar22._12_4_ * auVar139._12_4_;
              auVar172._16_4_ = auVar22._16_4_ * auVar139._16_4_;
              auVar172._20_4_ = auVar22._20_4_ * auVar139._20_4_;
              auVar172._24_4_ = auVar22._24_4_ * auVar139._24_4_;
              auVar172._28_4_ = 0;
              auVar116 = vfmsub231ps_fma(auVar172,auVar180,auVar21);
              auVar69._4_4_ = auVar180._4_4_ * auVar169._4_4_;
              auVar69._0_4_ = auVar180._0_4_ * auVar169._0_4_;
              auVar69._8_4_ = auVar180._8_4_ * auVar169._8_4_;
              auVar69._12_4_ = auVar180._12_4_ * auVar169._12_4_;
              auVar69._16_4_ = auVar180._16_4_ * auVar169._16_4_;
              auVar69._20_4_ = auVar180._20_4_ * auVar169._20_4_;
              auVar69._24_4_ = auVar180._24_4_ * auVar169._24_4_;
              auVar69._28_4_ = auVar169._28_4_;
              auVar117 = vfmsub231ps_fma(auVar69,auVar139,auVar16);
              auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar116),ZEXT1632(auVar117));
              auVar130 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar94),ZEXT832(0) << 0x20);
              auVar123 = vrcpps_avx(ZEXT1632(auVar130));
              auVar205._8_4_ = 0x3f800000;
              auVar205._0_8_ = &DAT_3f8000003f800000;
              auVar205._12_4_ = 0x3f800000;
              auVar205._16_4_ = 0x3f800000;
              auVar205._20_4_ = 0x3f800000;
              auVar205._24_4_ = 0x3f800000;
              auVar205._28_4_ = 0x3f800000;
              auVar206 = ZEXT3264(auVar205);
              auVar95 = vfnmadd213ps_fma(auVar123,ZEXT1632(auVar130),auVar205);
              auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar123,auVar123);
              auVar145._0_4_ = auVar117._0_4_ * auVar105._0_4_;
              auVar145._4_4_ = auVar117._4_4_ * auVar105._4_4_;
              auVar145._8_4_ = auVar117._8_4_ * auVar105._8_4_;
              auVar145._12_4_ = auVar117._12_4_ * auVar105._12_4_;
              auVar145._16_4_ = auVar105._16_4_ * 0.0;
              auVar145._20_4_ = auVar105._20_4_ * 0.0;
              auVar145._24_4_ = auVar105._24_4_ * 0.0;
              auVar145._28_4_ = 0;
              auVar116 = vfmadd231ps_fma(auVar145,ZEXT1632(auVar116),auVar106);
              auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar98,ZEXT1632(auVar94));
              fVar129 = auVar95._0_4_;
              fVar128 = auVar95._4_4_;
              fVar108 = auVar95._8_4_;
              fVar109 = auVar95._12_4_;
              auVar105 = ZEXT1632(CONCAT412(fVar109 * auVar116._12_4_,
                                            CONCAT48(fVar108 * auVar116._8_4_,
                                                     CONCAT44(fVar128 * auVar116._4_4_,
                                                              fVar129 * auVar116._0_4_))));
              auVar166 = ZEXT3264(auVar105);
              uVar91 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar146._4_4_ = uVar91;
              auVar146._0_4_ = uVar91;
              auVar146._8_4_ = uVar91;
              auVar146._12_4_ = uVar91;
              auVar146._16_4_ = uVar91;
              auVar146._20_4_ = uVar91;
              auVar146._24_4_ = uVar91;
              auVar146._28_4_ = uVar91;
              auVar79._4_4_ = uStack_5dc;
              auVar79._0_4_ = local_5e0;
              auVar79._8_4_ = uStack_5d8;
              auVar79._12_4_ = uStack_5d4;
              auVar79._16_4_ = uStack_5d0;
              auVar79._20_4_ = uStack_5cc;
              auVar79._24_4_ = uStack_5c8;
              auVar79._28_4_ = uStack_5c4;
              auVar98 = vcmpps_avx(auVar79,auVar105,2);
              auVar106 = vcmpps_avx(auVar105,auVar146,2);
              auVar98 = vandps_avx(auVar106,auVar98);
              auVar95 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
              auVar17 = vpand_avx(auVar17,auVar95);
              auVar98 = vpmovsxwd_avx2(auVar17);
              if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar98 >> 0x7f,0) == '\0') &&
                    (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar98 >> 0xbf,0) == '\0') &&
                  (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar98[0x1f]) goto LAB_016509cb;
              auVar98 = vcmpps_avx(ZEXT1632(auVar130),ZEXT832(0) << 0x20,4);
              auVar95 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
              auVar17 = vpand_avx(auVar17,auVar95);
              auVar98 = vpmovsxwd_avx2(auVar17);
              auVar147._8_8_ = uStack_5f8;
              auVar147._0_8_ = local_600;
              auVar147._16_8_ = uStack_5f0;
              auVar147._24_8_ = uStack_5e8;
              if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar98 >> 0x7f,0) != '\0') ||
                    (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar98 >> 0xbf,0) != '\0') ||
                  (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar98[0x1f] < '\0') {
                auVar123 = ZEXT1632(CONCAT412(fVar109 * auVar19._12_4_,
                                              CONCAT48(fVar108 * auVar19._8_4_,
                                                       CONCAT44(fVar128 * auVar19._4_4_,
                                                                fVar129 * auVar19._0_4_))));
                auVar70._28_4_ = SUB84(uStack_5e8,4);
                auVar70._0_28_ =
                     ZEXT1628(CONCAT412(fVar109 * auVar96._12_4_,
                                        CONCAT48(fVar108 * auVar96._8_4_,
                                                 CONCAT44(fVar128 * auVar96._4_4_,
                                                          fVar129 * auVar96._0_4_))));
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = &DAT_3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar106 = vsubps_avx(auVar181,auVar123);
                _local_2e0 = vblendvps_avx(auVar106,auVar123,auVar100);
                auVar106 = vsubps_avx(auVar181,auVar70);
                local_4c0 = vblendvps_avx(auVar106,auVar70,auVar100);
                local_300 = auVar105;
                auVar147 = auVar98;
              }
            }
            auVar188 = ZEXT3264(CONCAT428(fStack_6c4,
                                          CONCAT424(fStack_6c8,
                                                    CONCAT420(fStack_6cc,
                                                              CONCAT416(fStack_6d0,
                                                                        CONCAT412(fStack_6d4,
                                                                                  CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
            if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar147 >> 0x7f,0) == '\0') &&
                  (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0xbf,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar147[0x1f]) {
              auVar148 = ZEXT3264(local_6a0);
              auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,CONCAT416(
                                                  fVar142,CONCAT412(fVar149,CONCAT48(fVar142,uVar92)
                                                                   ))))));
            }
            else {
              auVar98 = vsubps_avx(local_520,auVar99);
              auVar17 = vfmadd213ps_fma(auVar98,_local_2e0,auVar99);
              fVar129 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar71._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * fVar129;
              auVar71._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * fVar129;
              auVar71._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * fVar129;
              auVar71._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * fVar129;
              auVar71._16_4_ = fVar129 * 0.0;
              auVar71._20_4_ = fVar129 * 0.0;
              auVar71._24_4_ = fVar129 * 0.0;
              auVar71._28_4_ = fVar129;
              auVar166 = ZEXT3264(local_300);
              auVar98 = vcmpps_avx(local_300,auVar71,6);
              auVar106 = auVar147 & auVar98;
              if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar106 >> 0x7f,0) == '\0') &&
                    (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar106 >> 0xbf,0) == '\0') &&
                  (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar106[0x1f]) {
                auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,CONCAT416(
                                                  fVar142,CONCAT412(fVar149,CONCAT48(fVar142,uVar92)
                                                                   ))))));
              }
              else {
                local_380 = vandps_avx(auVar98,auVar147);
                auVar125._8_4_ = 0xbf800000;
                auVar125._0_8_ = 0xbf800000bf800000;
                auVar125._12_4_ = 0xbf800000;
                auVar125._16_4_ = 0xbf800000;
                auVar125._20_4_ = 0xbf800000;
                auVar125._24_4_ = 0xbf800000;
                auVar125._28_4_ = 0xbf800000;
                auVar140._8_4_ = 0x40000000;
                auVar140._0_8_ = 0x4000000040000000;
                auVar140._12_4_ = 0x40000000;
                auVar140._16_4_ = 0x40000000;
                auVar140._20_4_ = 0x40000000;
                auVar140._24_4_ = 0x40000000;
                auVar140._28_4_ = 0x40000000;
                auVar17 = vfmadd213ps_fma(local_4c0,auVar140,auVar125);
                local_440 = _local_2e0;
                local_420 = ZEXT1632(auVar17);
                local_400 = local_300;
                local_3c0 = local_610._0_8_;
                uStack_3b8 = local_610._8_8_;
                local_3b0 = local_620._0_8_;
                uStack_3a8 = local_620._8_8_;
                local_3a0 = local_630._0_8_;
                uStack_398 = local_630._8_8_;
                pGVar11 = (context->scene->geometries).items[uVar85].ptr;
                local_4c0 = local_420;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar87 = 0;
                  auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,
                                                  CONCAT416(fVar142,CONCAT412(fVar149,CONCAT48(
                                                  fVar142,uVar92)))))));
                }
                else {
                  auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,
                                                  CONCAT416(fVar142,CONCAT412(fVar149,CONCAT48(
                                                  fVar142,uVar92)))))));
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar87 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar129 = (float)local_3e0;
                    local_360[0] = (fVar129 + (float)local_2e0._0_4_ + 0.0) * local_160;
                    local_360[1] = (fVar129 + (float)local_2e0._4_4_ + 1.0) * fStack_15c;
                    local_360[2] = (fVar129 + fStack_2d8 + 2.0) * fStack_158;
                    local_360[3] = (fVar129 + fStack_2d4 + 3.0) * fStack_154;
                    fStack_350 = (fVar129 + fStack_2d0 + 4.0) * fStack_150;
                    fStack_34c = (fVar129 + fStack_2cc + 5.0) * fStack_14c;
                    fStack_348 = (fVar129 + fStack_2c8 + 6.0) * fStack_148;
                    fStack_344 = fVar129 + fStack_2c4 + 7.0;
                    local_4c0._0_8_ = auVar17._0_8_;
                    local_4c0._8_8_ = auVar17._8_8_;
                    local_340 = local_4c0._0_8_;
                    uStack_338 = local_4c0._8_8_;
                    uStack_330 = 0;
                    uStack_328 = 0;
                    local_320 = local_300._0_8_;
                    uStack_318 = local_300._8_8_;
                    uStack_310 = local_300._16_8_;
                    uStack_308 = local_300._24_8_;
                    uVar83 = vmovmskps_avx(local_380);
                    local_6c0 = ZEXT1632(CONCAT124(auVar20._4_12_,
                                                   (int)CONCAT71((int7)((ulong)context >> 8),
                                                                 uVar83 != 0)));
                    if (uVar83 != 0) {
                      lVar24 = 0;
                      local_8c0 = (ulong)(uVar83 & 0xff);
                      for (uVar84 = local_8c0; (uVar84 & 1) == 0;
                          uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                        lVar24 = lVar24 + 1;
                      }
                      local_920 = ZEXT1632(CONCAT88(auVar14._8_8_,lVar24));
                      local_680 = ZEXT1632(local_610);
                      local_5a0 = ZEXT1632(local_620);
                      _local_5c0 = ZEXT1632(local_630);
                      local_3dc = iVar82;
                      local_3d0 = uVar74;
                      uStack_3c8 = uVar75;
                      do {
                        uVar91 = *(undefined4 *)(ray + k * 4 + 0x100);
                        local_220 = local_360[local_920._0_8_];
                        local_200._4_4_ = *(undefined4 *)((long)&local_340 + local_920._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)((long)&local_320 + local_920._0_8_ * 4);
                        fVar108 = 1.0 - local_220;
                        auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar108 * fVar108)),
                                                  ZEXT416((uint)(local_220 * fVar108)),
                                                  ZEXT416(0xc0000000));
                        auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar108)),
                                                  ZEXT416((uint)(local_220 * local_220)),
                                                  ZEXT416(0x40000000));
                        fVar129 = auVar14._0_4_ * 3.0;
                        fVar128 = local_220 * local_220 * 3.0;
                        auVar161._0_4_ = fVar128 * (float)local_5c0._0_4_;
                        auVar161._4_4_ = fVar128 * (float)local_5c0._4_4_;
                        auVar161._8_4_ = fVar128 * fStack_5b8;
                        auVar161._12_4_ = fVar128 * fStack_5b4;
                        auVar166 = ZEXT1664(auVar161);
                        auVar133._4_4_ = fVar129;
                        auVar133._0_4_ = fVar129;
                        auVar133._8_4_ = fVar129;
                        auVar133._12_4_ = fVar129;
                        auVar14 = vfmadd132ps_fma(auVar133,auVar161,local_5a0._0_16_);
                        fVar129 = auVar17._0_4_ * 3.0;
                        auVar154._4_4_ = fVar129;
                        auVar154._0_4_ = fVar129;
                        auVar154._8_4_ = fVar129;
                        auVar154._12_4_ = fVar129;
                        auVar14 = vfmadd132ps_fma(auVar154,auVar14,local_680._0_16_);
                        fVar129 = fVar108 * fVar108 * -3.0;
                        local_750.context = context->user;
                        auVar134._4_4_ = fVar129;
                        auVar134._0_4_ = fVar129;
                        auVar134._8_4_ = fVar129;
                        auVar134._12_4_ = fVar129;
                        auVar17 = vfmadd132ps_fma(auVar134,auVar14,auVar15);
                        local_280 = auVar17._0_4_;
                        uStack_27c = local_280;
                        uStack_278 = local_280;
                        uStack_274 = local_280;
                        uStack_270 = local_280;
                        uStack_26c = local_280;
                        uStack_268 = local_280;
                        uStack_264 = local_280;
                        auVar14 = vmovshdup_avx(auVar17);
                        local_260 = auVar14._0_8_;
                        uStack_258 = local_260;
                        uStack_250 = local_260;
                        uStack_248 = local_260;
                        auVar14 = vshufps_avx(auVar17,auVar17,0xaa);
                        local_240 = auVar14._0_8_;
                        uStack_238 = local_240;
                        uStack_230 = local_240;
                        uStack_228 = local_240;
                        fStack_21c = local_220;
                        fStack_218 = local_220;
                        fStack_214 = local_220;
                        fStack_210 = local_220;
                        fStack_20c = local_220;
                        fStack_208 = local_220;
                        fStack_204 = local_220;
                        local_200._0_4_ = local_200._4_4_;
                        local_200._8_4_ = local_200._4_4_;
                        local_200._12_4_ = local_200._4_4_;
                        local_200._16_4_ = local_200._4_4_;
                        local_200._20_4_ = local_200._4_4_;
                        local_200._24_4_ = local_200._4_4_;
                        local_200._28_4_ = local_200._4_4_;
                        local_1e0 = CONCAT44(uStack_13c,local_140);
                        uStack_1d8 = CONCAT44(uStack_134,uStack_138);
                        uStack_1d0 = CONCAT44(uStack_12c,uStack_130);
                        uStack_1c8 = CONCAT44(uStack_124,uStack_128);
                        local_1c0._4_4_ = uStack_11c;
                        local_1c0._0_4_ = local_120;
                        local_1c0._8_4_ = uStack_118;
                        local_1c0._12_4_ = uStack_114;
                        local_1c0._16_4_ = uStack_110;
                        local_1c0._20_4_ = uStack_10c;
                        local_1c0._24_4_ = uStack_108;
                        local_1c0._28_4_ = uStack_104;
                        vpcmpeqd_avx2(local_1c0,local_1c0);
                        local_1a0 = (local_750.context)->instID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = (local_750.context)->instPrimID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_660 = local_2c0._0_8_;
                        uStack_658 = local_2c0._8_8_;
                        uStack_650 = local_2c0._16_8_;
                        uStack_648 = local_2c0._24_8_;
                        local_750.valid = (int *)&local_660;
                        local_750.geometryUserPtr = pGVar11->userPtr;
                        local_750.hit = (RTCHitN *)&local_280;
                        local_750.N = 8;
                        local_750.ray = (RTCRayN *)ray;
                        if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar166 = ZEXT1664(auVar161);
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          (*pGVar11->occlusionFilterN)(&local_750);
                        }
                        auVar77._8_8_ = uStack_658;
                        auVar77._0_8_ = local_660;
                        auVar77._16_8_ = uStack_650;
                        auVar77._24_8_ = uStack_648;
                        auVar106 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar77)
                        ;
                        auVar98 = _DAT_0205a980 & ~auVar106;
                        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar98 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar98 >> 0x7f,0) == '\0') &&
                              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar98 >> 0xbf,0) == '\0') &&
                            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar98[0x1f]) {
                          auVar106 = auVar106 ^ _DAT_0205a980;
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar166 = ZEXT1664(auVar166._0_16_);
                            auVar206 = ZEXT1664(auVar206._0_16_);
                            (*p_Var13)(&local_750);
                          }
                          auVar78._8_8_ = uStack_658;
                          auVar78._0_8_ = local_660;
                          auVar78._16_8_ = uStack_650;
                          auVar78._24_8_ = uStack_648;
                          auVar98 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar78
                                                 );
                          auVar106 = auVar98 ^ _DAT_0205a980;
                          auVar141._8_4_ = 0xff800000;
                          auVar141._0_8_ = 0xff800000ff800000;
                          auVar141._12_4_ = 0xff800000;
                          auVar141._16_4_ = 0xff800000;
                          auVar141._20_4_ = 0xff800000;
                          auVar141._24_4_ = 0xff800000;
                          auVar141._28_4_ = 0xff800000;
                          auVar98 = vblendvps_avx(auVar141,*(undefined1 (*) [32])
                                                            (local_750.ray + 0x100),auVar98);
                          *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar98;
                        }
                        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar106 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar106 >> 0x7f,0) != '\0')
                              || (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar106 >> 0xbf,0) != '\0') ||
                            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar106[0x1f] < '\0') break;
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar91;
                        lVar24 = 0;
                        local_8c0 = local_8c0 ^ 1L << (local_920._0_8_ & 0x3f);
                        for (uVar84 = local_8c0; (uVar84 & 1) == 0;
                            uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                          lVar24 = lVar24 + 1;
                        }
                        local_920._0_8_ = lVar24;
                        local_6c0._0_4_ = (int)CONCAT71((int7)((ulong)lVar24 >> 8),local_8c0 != 0);
                      } while (local_8c0 != 0);
                    }
                    bVar87 = local_6c0[0] & 1;
                    auVar188 = ZEXT3264(CONCAT428(fStack_6c4,
                                                  CONCAT424(fStack_6c8,
                                                            CONCAT420(fStack_6cc,
                                                                      CONCAT416(fStack_6d0,
                                                                                CONCAT412(fStack_6d4
                                                                                          ,CONCAT48(
                                                  fStack_6d8,CONCAT44(fStack_6dc,local_6e0))))))));
                    auVar126 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar142,CONCAT420(fVar149,
                                                  CONCAT416(fVar142,CONCAT412(fVar149,CONCAT48(
                                                  fVar142,uVar92)))))));
                  }
                }
                bVar81 = (bool)(bVar81 | bVar87);
              }
              auVar148 = ZEXT3264(local_6a0);
            }
          }
          lVar88 = lVar88 + 8;
        } while ((int)lVar88 < iVar82);
      }
      if (bVar81 != false) {
        return bVar90;
      }
      uVar91 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar97._4_4_ = uVar91;
      auVar97._0_4_ = uVar91;
      auVar97._8_4_ = uVar91;
      auVar97._12_4_ = uVar91;
      auVar14 = vcmpps_avx(local_460,auVar97,2);
      uVar85 = vmovmskps_avx(auVar14);
      uVar85 = (uint)uVar89 & uVar85;
      bVar90 = uVar85 != 0;
    } while (bVar90);
  }
  return bVar90;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }